

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O3

double __thiscall mathiu::impl::pow(impl *this,double __x,double __y)

{
  _Head_base<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false> *idPat;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ExprPtr *pEVar2;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  **pp_Var3;
  bool bVar4;
  enable_if_t<_isTupleLikeV<const_mathiu::impl::Power_&>_&&_isRangeV<const_mathiu::impl::Power_&>,_bool>
  eVar5;
  IdBlock<int> *pIVar6;
  IdBlock<int> *pIVar7;
  undefined1 *puVar8;
  variant_alternative_t<1UL,_variant<monostate,_const_Power_*,_const_Product_*,_const_Fraction_*,_const_int_*,_bool>_>
  *value;
  IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_> *pIVar9;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>,_std::variant<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>_&>
  pIVar10;
  shared_ptr<const_mathiu::impl::Expr> *lhs;
  variant_alternative_t<2UL,_variant<monostate,_const_Power_*,_const_Product_*,_const_Fraction_*,_const_int_*,_bool>_>
  *value_00;
  IdBlockBase<mathiu::impl::Product> *pIVar11;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>,_std::variant<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>_&>
  pIVar12;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>,_const_std::variant<std::monostate,_mathiu::impl::Product,_mathiu::impl::Product_*,_const_mathiu::impl::Product_*>_&>
  pPVar13;
  _Base_ptr p_Var14;
  variant_alternative_t<3UL,_variant<monostate,_const_Power_*,_const_Product_*,_const_Fraction_*,_const_int_*,_bool>_>
  *value_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **pp_Var16;
  variant_alternative_t<4UL,_variant<monostate,_const_Power_*,_const_Product_*,_const_Fraction_*,_const_int_*,_bool>_>
  *value_02;
  int *piVar17;
  logic_error *this_01;
  Expr *__tmp;
  RetType_conflict *result;
  ExprPtr *in_RDX;
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
  *p;
  tuple<const_mathiu::impl::Expr_&,_const_mathiu::impl::Expr_&> *value_03;
  code *pcVar18;
  IdProcess IVar19;
  long lVar20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **in_RSI;
  undefined *puVar21;
  _Rb_tree_header *p_Var22;
  int iVar23;
  int iVar40;
  undefined1 auVar25 [16];
  double __x_00;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar24;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  double extraout_XMM0_Qa_01;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar50 [16];
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  Id<int> ii1;
  Id<int> ii2;
  Id<int> ii3;
  Id<std::shared_ptr<const_mathiu::impl::Expr>_> iu;
  Id<std::shared_ptr<const_mathiu::impl::Expr>_> iv;
  undefined1 local_1188 [16];
  PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:521:78)>
  *local_1178;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1170;
  PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:521:78)>
  *local_1168;
  PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:521:78)>
  *local_1160;
  undefined8 local_1158;
  int iStack_1150;
  int iStack_114c;
  undefined8 local_1148;
  int iStack_1140;
  int iStack_113c;
  undefined4 local_1130;
  int local_112c;
  ExprPtr local_1128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1110;
  impl *local_1100;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> local_10f8;
  byte local_10e0;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> local_10d8;
  byte local_10c0;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> local_10b8;
  byte local_10a0;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> local_1098;
  byte local_1080;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1078;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1070;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1068;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1060;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  *local_1058 [2];
  App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>_>
  local_1048;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **local_1020;
  App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>_>
  local_1018;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **local_ff0;
  undefined1 *local_fe8;
  undefined1 *puStack_fe0;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> local_fd8;
  undefined1 local_fc0;
  undefined1 *local_fb8;
  int *piStack_fb0;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_fa8;
  App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>
  local_f98;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *local_f58;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *local_f50;
  undefined1 *local_f48;
  undefined1 *puStack_f40;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> local_f38;
  byte local_f20;
  undefined1 *local_f18;
  undefined1 uStack_f10;
  undefined7 uStack_f0f;
  AsPointer<int> *local_f08;
  anon_class_1_0_00000001 *paStack_f00;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> local_ef8;
  byte local_ee0;
  anon_class_1_0_00000001 *local_ed8;
  InternalPatternT<bool> IStack_ed0;
  undefined7 uStack_ecf;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> local_ec0;
  byte local_ea8;
  undefined1 *local_ea0;
  undefined1 *local_e98;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_e88;
  App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>
  local_e78;
  App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>_>
  local_e50;
  ExprPtr *local_e28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **local_e20;
  undefined1 *local_e18;
  undefined1 *local_e10;
  undefined4 local_e08;
  undefined4 uStack_e04;
  undefined4 uStack_e00;
  undefined8 uStack_dfc;
  undefined4 local_df4;
  undefined1 local_df0;
  undefined4 local_de8;
  undefined4 uStack_de4;
  undefined4 uStack_de0;
  undefined8 uStack_ddc;
  undefined4 local_dd4;
  undefined1 local_dd0;
  undefined1 *local_dc8;
  undefined1 local_dc0;
  AsPointer<int> *local_db8;
  anon_class_1_0_00000001 *paStack_db0;
  undefined4 local_da8;
  undefined4 uStack_da4;
  undefined4 uStack_da0;
  undefined8 uStack_d9c;
  undefined4 local_d94;
  undefined1 local_d90;
  anon_class_1_0_00000001 *local_d88;
  InternalPatternT<bool> IStack_d80;
  undefined7 uStack_d7f;
  AsPointer<mathiu::impl::Fraction> *local_d78;
  anon_class_1_0_00000001 *paStack_d70;
  undefined4 local_d68;
  undefined4 uStack_d64;
  undefined4 uStack_d60;
  undefined8 uStack_d5c;
  undefined4 local_d54;
  undefined1 local_d50;
  undefined4 local_d48;
  undefined4 uStack_d44;
  undefined4 uStack_d40;
  undefined8 uStack_d3c;
  undefined4 local_d34;
  undefined1 local_d30;
  anon_class_1_0_00000001 *local_d28;
  InternalPatternT<bool> IStack_d20;
  undefined7 uStack_d1f;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *local_d18;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *local_d10;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *local_d08;
  _Variadic_union<std::monostate,_const_mathiu::impl::Power_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::Fraction_*,_const_int_*,_bool>
  local_cf8;
  _Variadic_union<std::monostate,_mathiu::impl::Product,_mathiu::impl::Product_*,_const_mathiu::impl::Product_*>
  _Stack_cf0;
  undefined8 local_cc0;
  undefined1 local_c80 [424];
  long local_ad8;
  anon_class_1_0_00000001 local_ad0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **local_ac8;
  ExprPtr *local_ac0;
  App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>_>
  local_ab8;
  App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>_>
  local_a88;
  App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>
  local_a58;
  AsPointer<mathiu::impl::Product> *local_a30;
  anon_class_1_0_00000001 *paStack_a28;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  local_a20;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_9d8;
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  *local_9c8;
  ExprPtr *local_9c0;
  undefined1 *local_9b8;
  undefined1 *puStack_9b0;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> local_9a8;
  byte local_990;
  undefined1 *local_988;
  undefined4 *puStack_980;
  undefined1 *local_978;
  undefined1 uStack_970;
  undefined7 uStack_96f;
  undefined1 *local_968;
  undefined1 *puStack_960;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> local_958;
  byte local_940;
  undefined1 *local_938;
  undefined8 uStack_930;
  undefined1 *local_928;
  undefined1 *puStack_920;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> local_918;
  byte local_900;
  undefined1 *local_8f8;
  int *piStack_8f0;
  anon_class_1_0_00000001 *local_8e8;
  InternalPatternT<bool> IStack_8e0;
  undefined7 uStack_8df;
  AsPointer<int> *local_8d8;
  anon_class_1_0_00000001 *paStack_8d0;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> local_8c8;
  byte local_8b0;
  anon_class_1_0_00000001 *local_8a8;
  InternalPatternT<bool> IStack_8a0;
  undefined7 uStack_89f;
  undefined1 *local_898;
  undefined1 *puStack_890;
  undefined4 local_888;
  undefined4 uStack_884;
  undefined4 uStack_880;
  undefined8 uStack_87c;
  undefined4 local_874;
  undefined1 local_870;
  undefined1 *local_868;
  undefined4 *puStack_860;
  undefined1 *local_858;
  undefined8 uStack_850;
  undefined1 *local_848;
  undefined1 *puStack_840;
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined8 uStack_82c;
  undefined4 local_824;
  undefined1 local_820;
  undefined1 *local_818;
  undefined8 uStack_810;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *local_808;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *local_800;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  local_7f0;
  undefined1 *local_7c8;
  undefined1 *puStack_7c0;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> local_7b8;
  byte local_7a0;
  undefined1 *local_798;
  undefined4 *puStack_790;
  undefined1 *local_788;
  undefined8 uStack_780;
  undefined1 *local_778;
  undefined1 *puStack_770;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> local_768;
  byte local_750;
  undefined1 *local_748;
  undefined8 uStack_740;
  undefined1 *local_738;
  undefined1 *puStack_730;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> local_728;
  byte local_710;
  undefined1 *local_708;
  int *piStack_700;
  anon_class_1_0_00000001 *local_6f8;
  InternalPatternT<bool> IStack_6f0;
  undefined7 uStack_6ef;
  AsPointer<int> *local_6e8;
  anon_class_1_0_00000001 *paStack_6e0;
  _Variadic_union<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> local_6d8;
  byte local_6c0;
  anon_class_1_0_00000001 *local_6b8;
  InternalPatternT<bool> IStack_6b0;
  undefined7 uStack_6af;
  App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>_>
  local_6a8;
  AsPointer<mathiu::impl::Power> *local_680;
  anon_class_1_0_00000001 *paStack_678;
  _Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  local_670;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_620;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  *local_610;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  **local_608;
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  local_600;
  undefined1 local_5c0;
  AsPointer<int> *local_5b8;
  anon_class_1_0_00000001 *paStack_5b0;
  undefined8 local_5a8;
  anon_class_1_0_00000001 *paStack_5a0;
  InternalPatternT<bool> local_598;
  undefined7 uStack_597;
  AsPointer<mathiu::impl::Power> *local_590;
  anon_class_1_0_00000001 *paStack_588;
  _Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  local_580;
  anon_class_1_0_00000001 *local_530;
  InternalPatternT<bool> IStack_528;
  undefined7 uStack_527;
  _Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  local_520;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  local_4d0;
  AsPointer<int> *local_4a8;
  anon_class_1_0_00000001 *paStack_4a0;
  undefined8 local_498;
  anon_class_1_0_00000001 *paStack_490;
  InternalPatternT<bool> local_488;
  undefined7 uStack_487;
  AsPointer<mathiu::impl::Power> *local_480;
  anon_class_1_0_00000001 *paStack_478;
  _Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  local_470;
  anon_class_1_0_00000001 *local_420;
  InternalPatternT<bool> IStack_418;
  undefined7 uStack_417;
  AsPointer<int> *local_408;
  anon_class_1_0_00000001 *paStack_400;
  undefined8 local_3f8;
  anon_class_1_0_00000001 *paStack_3f0;
  InternalPatternT<bool> local_3e8;
  undefined7 uStack_3e7;
  AsPointer<mathiu::impl::Product> *local_3e0;
  anon_class_1_0_00000001 *paStack_3d8;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  local_3d0;
  anon_class_1_0_00000001 *local_388;
  InternalPatternT<bool> IStack_380;
  undefined7 uStack_37f;
  App<const_matchit::impl::AsPointer<mathiu::impl::Power>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>
  local_378;
  AsPointer<int> *local_300;
  anon_class_1_0_00000001 *paStack_2f8;
  undefined8 local_2f0;
  anon_class_1_0_00000001 *paStack_2e8;
  InternalPatternT<bool> local_2e0;
  undefined7 uStack_2df;
  AsPointer<mathiu::impl::Product> *local_2d8;
  anon_class_1_0_00000001 *paStack_2d0;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  local_2c8;
  anon_class_1_0_00000001 *local_280;
  InternalPatternT<bool> IStack_278;
  undefined7 uStack_277;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  local_270;
  App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>
  local_228;
  PatternHelper<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>_>
  local_1b8;
  undefined1 local_110 [64];
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
  local_d0;
  
  result = (RetType_conflict *)local_1188;
  local_1100 = this;
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_7f0);
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_4d0);
  local_10f8._M_first._M_storage.super_IdBlockBase<int>.mDepth = 0;
  local_10f8._4_8_ = ZEXT48((uint)local_cf8._0_4_);
  local_10f8._12_8_ = 0;
  local_10f8._20_4_ = 0;
  local_10e0 = 0;
  local_10d8._M_first._M_storage.super_IdBlockBase<int>.mDepth = 0;
  local_10d8._4_8_ = ZEXT48((uint)local_cf8._0_4_);
  local_10d8._12_8_ = 0;
  local_10d8._20_4_ = 0;
  local_10c0 = 0;
  local_cf8._4_4_ = 0;
  local_ec0._M_first._M_storage.super_IdBlockBase<int>.mDepth = 0;
  local_ec0._4_8_ = ZEXT48((uint)local_cf8._0_4_);
  local_ec0._12_8_ = 0;
  local_ec0._20_4_ = 0;
  local_ea8 = 0;
  local_cf8._0_4_ = 0;
  _Stack_cf0._0_4_ = 0;
  _Stack_cf0._4_4_ = 0;
  _Stack_cf0._8_4_ = 0;
  _Stack_cf0._12_4_ = 0;
  _Stack_cf0._16_8_ = 0;
  _Stack_cf0._24_8_ = 0;
  _Stack_cf0._32_8_ = 0;
  _Stack_cf0._40_8_ = 0;
  local_cc0 = 0;
  local_600._0_4_ = 0;
  local_600._M_first._M_storage._M_storage[0x38] = '\0';
  local_5c0 = 0;
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_mathiu::impl::Product,_mathiu::impl::Product_*,_const_mathiu::impl::Product_*>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_mathiu::impl::Product,_mathiu::impl::Product_*,_const_mathiu::impl::Product_*>
                       *)&_Stack_cf0);
  local_1168 = (PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:521:78)>
                *)*in_RSI;
  local_1160 = (PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:521:78)>
                *)(in_RDX->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>)
                  ._M_ptr;
  local_1058[0] = &local_4d0;
  std::
  _Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::_Tuple_impl(&local_520,(Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_7f0,
                (Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_4d0);
  matchit::impl::as<mathiu::impl::Power>::{lambda(auto:1)#1}::operator()
            (&local_378,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Power>,
             (Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
              *)&local_520);
  local_5b8 = (AsPointer<int> *)&matchit::impl::asPointer<int>;
  paStack_5b0 = (anon_class_1_0_00000001 *)&matchit::impl::deref;
  paStack_5a0 = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  local_598 = true;
  local_590 = local_378.mUnary;
  paStack_588 = local_378.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
                .
                super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
                .
                super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_false>
                ._M_head_impl.mUnary;
  local_1158 = in_RDX;
  std::
  _Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::_Tuple_impl(&local_580,
                (_Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                 *)&local_378.mPattern.mPatterns.
                    super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
                    .
                    super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
                    .
                    super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_false>
                    ._M_head_impl.mPattern);
  local_530 = local_378.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
              .
              super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
              ._M_head_impl.mUnary;
  IStack_528 = local_378.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl.mPattern;
  uStack_527 = local_378.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl._9_7_;
  local_4a8 = local_5b8;
  paStack_4a0 = paStack_5b0;
  local_498 = local_5a8;
  paStack_490 = paStack_5a0;
  uStack_487 = uStack_597;
  local_488 = local_598;
  local_480 = local_590;
  paStack_478 = paStack_588;
  std::
  _Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::_Tuple_impl(&local_470,&local_580);
  local_420 = local_530;
  IStack_418 = IStack_528;
  uStack_417 = uStack_527;
  local_6a8.mUnary = local_4a8;
  local_6a8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>,_false>
  ._M_head_impl.mUnary = paStack_4a0;
  local_6a8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>,_false>
  ._M_head_impl._8_8_ = local_498;
  local_6a8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mUnary = paStack_490;
  local_6a8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mPattern = local_488;
  local_6a8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl._9_7_ = uStack_487;
  local_680 = local_480;
  paStack_678 = paStack_478;
  std::
  _Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::_Tuple_impl(&local_670,&local_470);
  local_620.mUnary = local_420;
  local_620.mPattern = IStack_418;
  local_620._9_7_ = uStack_417;
  local_608 = local_1058;
  local_610 = &local_7f0;
  matchit::impl::Id<mathiu::impl::Product>::Id
            ((Id<mathiu::impl::Product> *)&local_270,
             (Id<mathiu::impl::Product> *)&local_600._M_first);
  matchit::impl::as<mathiu::impl::Product>::{lambda(auto:1)#1}::operator()
            (&local_228,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Product>,
             (Id<mathiu::impl::Product> *)&local_270);
  local_300 = (AsPointer<int> *)&matchit::impl::asPointer<int>;
  paStack_2f8 = (anon_class_1_0_00000001 *)&matchit::impl::deref;
  paStack_2e8 = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  local_2e0 = true;
  local_2d8 = local_228.mUnary;
  paStack_2d0 = local_228.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>
                .
                super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>
                .
                super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>,_false>
                ._M_head_impl.mUnary;
  matchit::impl::Id<mathiu::impl::Product>::Id
            ((Id<mathiu::impl::Product> *)&local_2c8,
             &local_228.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>,_false>
              ._M_head_impl.mPattern);
  local_280 = local_228.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>
              .
              super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
              ._M_head_impl.mUnary;
  IStack_278 = local_228.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl.mPattern;
  uStack_277 = local_228.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl._9_7_;
  local_408 = local_300;
  paStack_400 = paStack_2f8;
  local_3f8 = local_2f0;
  paStack_3f0 = paStack_2e8;
  uStack_3e7 = uStack_2df;
  local_3e8 = local_2e0;
  local_3e0 = local_2d8;
  paStack_3d8 = paStack_2d0;
  matchit::impl::Id<mathiu::impl::Product>::Id
            ((Id<mathiu::impl::Product> *)&local_3d0,(Id<mathiu::impl::Product> *)&local_2c8);
  local_388 = local_280;
  IStack_380 = IStack_278;
  uStack_37f = uStack_277;
  local_a58.mUnary = local_408;
  local_a58.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>,_false>
  ._M_head_impl.mUnary = paStack_400;
  local_a58.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>,_false>
  ._M_head_impl._8_8_ = local_3f8;
  local_a58.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mUnary = paStack_3f0;
  local_a58.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mPattern = local_3e8;
  local_a58.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl._9_7_ = uStack_3e7;
  local_a30 = local_3e0;
  paStack_a28 = paStack_3d8;
  local_1148 = in_RSI;
  matchit::impl::Id<mathiu::impl::Product>::Id
            ((Id<mathiu::impl::Product> *)&local_a20,(Id<mathiu::impl::Product> *)&local_3d0);
  pEVar2 = local_1158;
  local_9d8.mUnary = local_388;
  local_9d8.mPattern = IStack_380;
  local_9d8._9_7_ = uStack_37f;
  local_9c0 = local_1158;
  local_9c8 = &local_600;
  local_1060 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  local_1060->_M_use_count = 1;
  local_1060->_M_weak_count = 1;
  local_1060->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00263778;
  local_1068 = local_1060 + 1;
  *(undefined4 *)&local_1060[1]._vptr__Sp_counted_base = 0;
  *(undefined1 *)&local_1060[4]._M_use_count = 0;
  local_e20 = &local_1068;
  local_ea0 = &matchit::impl::asPointer<mathiu::impl::Fraction>;
  local_e98 = &matchit::impl::deref;
  local_e88.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  local_e88.mPattern = true;
  local_e78.mUnary = (AsPointer<int> *)&matchit::impl::asPointer<int>;
  local_e78.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::deref;
  local_e78.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  local_e78.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Wildcard>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mPattern = true;
  local_e50.mUnary = (AsPointer<int> *)&matchit::impl::asPointer<int>;
  local_e50.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::deref;
  local_e50.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>,_false>
  ._M_head_impl.mPattern = 0;
  local_e50.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  local_e50.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mPattern = true;
  local_e28 = pEVar2;
  local_a88.mUnary = (AsPointer<int> *)&matchit::impl::asPointer<int>;
  local_a88.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::deref;
  local_a88.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>,_false>
  ._M_head_impl.mPattern = 0;
  local_a88.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  local_a88.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mPattern = true;
  local_ab8.mUnary = (AsPointer<int> *)&matchit::impl::asPointer<int>;
  local_ab8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::deref;
  local_ab8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>,_false>
  ._M_head_impl.mPattern = 1;
  local_ab8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  local_ab8.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mPattern = true;
  local_1070 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  local_1070->_M_use_count = 1;
  local_1070->_M_weak_count = 1;
  local_1070->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00263778;
  local_1078 = local_1070 + 1;
  *(undefined4 *)&local_1070[1]._vptr__Sp_counted_base = 1;
  *(undefined1 *)&local_1070[4]._M_use_count = 0;
  local_ff0 = &local_1078;
  local_1018.mUnary = (AsPointer<int> *)&matchit::impl::asPointer<int>;
  local_1018.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::deref;
  local_1018.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>,_false>
  ._M_head_impl.mPattern = 0;
  local_1018.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  local_1018.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mPattern = true;
  local_1048.mUnary = (AsPointer<int> *)&matchit::impl::asPointer<int>;
  local_1048.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::deref;
  local_1048.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>,_false>
  ._M_head_impl.mPattern = 1;
  local_1048.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  local_1048.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mPattern = true;
  local_1020 = local_1148;
  pIVar6 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_10e0]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                       *)&local_cf8,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_10f8._M_first);
  local_f08 = (AsPointer<int> *)&matchit::impl::asPointer<int>;
  paStack_f00 = (anon_class_1_0_00000001 *)&matchit::impl::deref;
  local_cf8._4_4_ = 0;
  _Stack_cf0._0_4_ = 0;
  _Stack_cf0._4_4_ = 0;
  _Stack_cf0._8_4_ = 0;
  local_ef8._12_8_ = 0;
  local_ef8._8_4_ = 0;
  local_ef8._20_4_ = 0;
  local_ef8._M_first._M_storage.super_IdBlockBase<int>.mDepth = (int32_t)pIVar6;
  local_ef8._4_4_ = (undefined4)((ulong)pIVar6 >> 0x20);
  local_ee0 = 1;
  local_ed8 = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  IStack_ed0 = true;
  local_112c = 0;
  pIVar6 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_10c0]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                       *)&local_cf8,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_10d8._M_first);
  local_928 = &matchit::impl::asPointer<int>;
  puStack_920 = &matchit::impl::deref;
  local_918._12_8_ = 0;
  local_918._8_4_ = 0;
  local_918._20_4_ = 0;
  local_918._M_first._M_storage.super_IdBlockBase<int>.mDepth = (int32_t)pIVar6;
  local_918._4_4_ = (undefined4)((ulong)pIVar6 >> 0x20);
  local_900 = 1;
  local_8f8 = &matchit::impl::_;
  piStack_8f0 = &local_112c;
  local_8e8 = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  IStack_8e0 = true;
  local_8d8 = local_f08;
  paStack_8d0 = paStack_f00;
  local_cf8._4_4_ = 0;
  _Stack_cf0._0_4_ = 0;
  _Stack_cf0._4_4_ = 0;
  _Stack_cf0._8_4_ = 0;
  local_8c8._20_4_ = 0;
  local_8c8._12_8_ = 0;
  local_8c8._4_4_ = local_cf8._0_4_;
  local_8c8._8_4_ = 0;
  pIVar6 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_ee0]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                       *)&local_cf8,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_ef8._M_first);
  local_8c8._M_first._M_storage.super_IdBlockBase<int>.mDepth = (int32_t)pIVar6;
  local_8c8._4_4_ = (undefined4)((ulong)pIVar6 >> 0x20);
  local_8b0 = 1;
  uStack_89f = uStack_ecf;
  IStack_8a0 = IStack_ed0;
  local_8a8 = local_ed8;
  local_738 = local_928;
  puStack_730 = puStack_920;
  local_cf8._4_4_ = 0;
  _Stack_cf0._0_4_ = 0;
  _Stack_cf0._4_4_ = 0;
  _Stack_cf0._8_4_ = 0;
  local_728._12_8_ = 0;
  local_728._4_4_ = local_cf8._0_4_;
  local_728._8_4_ = 0;
  local_728._20_4_ = 0;
  pIVar6 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_900]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                       *)&local_cf8,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_918._M_first);
  local_728._M_first._M_storage.super_IdBlockBase<int>.mDepth = (int32_t)pIVar6;
  local_728._4_4_ = (undefined4)((ulong)pIVar6 >> 0x20);
  local_710 = 1;
  local_708 = local_8f8;
  piStack_700 = piStack_8f0;
  uStack_6ef = uStack_8df;
  IStack_6f0 = IStack_8e0;
  local_6f8 = local_8e8;
  local_6e8 = local_8d8;
  paStack_6e0 = paStack_8d0;
  local_cf8._4_4_ = 0;
  _Stack_cf0._0_4_ = 0;
  _Stack_cf0._4_4_ = 0;
  _Stack_cf0._8_4_ = 0;
  local_6d8._20_4_ = 0;
  local_6d8._12_8_ = 0;
  local_6d8._4_4_ = local_cf8._0_4_;
  local_6d8._8_4_ = 0;
  pIVar6 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_8b0]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                       *)&local_cf8,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_8c8._M_first);
  local_6d8._M_first._M_storage.super_IdBlockBase<int>.mDepth = (int32_t)pIVar6;
  local_6d8._4_4_ = (undefined4)((ulong)pIVar6 >> 0x20);
  local_6c0 = 1;
  local_6b8 = local_8a8;
  IStack_6b0 = IStack_8a0;
  uStack_6af = uStack_89f;
  local_fe8 = local_738;
  puStack_fe0 = puStack_730;
  local_cf8._4_4_ = 0;
  _Stack_cf0._0_4_ = 0;
  _Stack_cf0._4_4_ = 0;
  _Stack_cf0._8_4_ = 0;
  local_fd8._12_8_ = 0;
  local_fd8._4_4_ = local_cf8._0_4_;
  local_fd8._8_4_ = 0;
  local_fd8._20_4_ = 0;
  pIVar6 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_710]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                       *)&local_cf8,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_728._M_first);
  local_fd8._M_first._M_storage.super_IdBlockBase<int>.mDepth = (int32_t)pIVar6;
  local_fd8._4_4_ = (undefined4)((ulong)pIVar6 >> 0x20);
  local_fc0 = 1;
  local_fb8 = local_708;
  piStack_fb0 = piStack_700;
  local_fa8.mUnary = local_6f8;
  local_fa8.mPattern = IStack_6f0;
  local_fa8._9_7_ = uStack_6ef;
  local_f98.mUnary = local_6e8;
  local_f98.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>,_false>
  ._M_head_impl.mUnary = paStack_6e0;
  local_cf8._4_4_ = 0;
  _Stack_cf0._0_4_ = 0;
  _Stack_cf0._4_4_ = 0;
  _Stack_cf0._8_4_ = 0;
  local_f98.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>,_false>
  ._M_head_impl.mPattern.mBlock.
  super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _20_4_ = 0;
  local_f98.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>,_false>
  ._M_head_impl.mPattern.mBlock.
  super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _12_8_ = 0;
  local_f98.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>,_false>
  ._M_head_impl.mPattern.mBlock.
  super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _4_4_ = local_cf8._0_4_;
  local_f98.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>,_false>
  ._M_head_impl.mPattern.mBlock.
  super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _8_4_ = 0;
  pIVar6 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_6c0]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                       *)&local_cf8,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_6d8._M_first);
  local_f98.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>,_false>
  ._M_head_impl.mPattern.mBlock.
  super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _M_first._M_storage.super_IdBlockBase<int>.mDepth = (int32_t)pIVar6;
  local_f98.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>,_false>
  ._M_head_impl.mPattern.mBlock.
  super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_u.
  _4_4_ = (undefined4)((ulong)pIVar6 >> 0x20);
  local_f98.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>,_false>
  ._M_head_impl.mPattern.mBlock.
  super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
  super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>._M_index
       = '\x01';
  local_f98.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mUnary = local_6b8;
  local_f98.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mPattern = IStack_6b0;
  local_f98.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl._9_7_ = uStack_6af;
  local_f58 = &local_10f8;
  local_f50 = &local_10d8;
  pIVar6 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_10e0]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                       *)&local_cf8,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_f58->_M_first);
  local_f48 = &matchit::impl::asPointer<int>;
  puStack_f40 = &matchit::impl::deref;
  local_cf8._4_4_ = 0;
  _Stack_cf0._0_4_ = 0;
  _Stack_cf0._4_4_ = 0;
  _Stack_cf0._8_4_ = 0;
  local_f38._12_8_ = 0;
  local_f38._8_4_ = 0;
  local_f38._20_4_ = 0;
  local_f38._M_first._M_storage.super_IdBlockBase<int>.mDepth = (int32_t)pIVar6;
  local_f38._4_4_ = (undefined4)((ulong)pIVar6 >> 0x20);
  local_f20 = 1;
  local_f18 = &matchit::impl::cast<bool>;
  uStack_f10 = 1;
  local_1130 = 0;
  pIVar6 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_10c0]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                       *)&local_cf8,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_10d8._M_first);
  local_9b8 = &matchit::impl::asPointer<int>;
  puStack_9b0 = &matchit::impl::deref;
  local_9a8._12_8_ = 0;
  local_9a8._8_4_ = 0;
  local_9a8._20_4_ = 0;
  local_9a8._M_first._M_storage.super_IdBlockBase<int>.mDepth = (int32_t)pIVar6;
  local_9a8._4_4_ = (undefined4)((ulong)pIVar6 >> 0x20);
  local_990 = 1;
  local_988 = &matchit::impl::_;
  puStack_980 = &local_1130;
  local_978 = &matchit::impl::cast<bool>;
  uStack_970 = 1;
  local_968 = local_f48;
  puStack_960 = puStack_f40;
  local_cf8._4_4_ = 0;
  _Stack_cf0._0_4_ = 0;
  _Stack_cf0._4_4_ = 0;
  _Stack_cf0._8_4_ = 0;
  local_958._20_4_ = 0;
  local_958._12_8_ = 0;
  local_958._4_4_ = local_cf8._0_4_;
  local_958._8_4_ = 0;
  pIVar6 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_f20]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                       *)&local_cf8,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_f38._M_first);
  local_958._M_first._M_storage.super_IdBlockBase<int>.mDepth = (int32_t)pIVar6;
  local_958._4_4_ = (undefined4)((ulong)pIVar6 >> 0x20);
  local_940 = 1;
  uStack_930 = CONCAT71(uStack_f0f,uStack_f10);
  local_938 = local_f18;
  local_7c8 = local_9b8;
  puStack_7c0 = puStack_9b0;
  local_cf8._4_4_ = 0;
  _Stack_cf0._0_4_ = 0;
  _Stack_cf0._4_4_ = 0;
  _Stack_cf0._8_4_ = 0;
  local_7b8._12_8_ = 0;
  local_7b8._4_4_ = local_cf8._0_4_;
  local_7b8._8_4_ = 0;
  local_7b8._20_4_ = 0;
  pIVar6 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_990]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                       *)&local_cf8,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_9a8._M_first);
  local_7b8._M_first._M_storage.super_IdBlockBase<int>.mDepth = (int32_t)pIVar6;
  local_7b8._4_4_ = (undefined4)((ulong)pIVar6 >> 0x20);
  local_7a0 = 1;
  local_798 = local_988;
  puStack_790 = puStack_980;
  uStack_780 = CONCAT71(uStack_96f,uStack_970);
  local_788 = local_978;
  local_778 = local_968;
  puStack_770 = puStack_960;
  local_cf8._4_4_ = 0;
  _Stack_cf0._0_4_ = 0;
  _Stack_cf0._4_4_ = 0;
  _Stack_cf0._8_4_ = 0;
  local_768._20_4_ = 0;
  local_768._12_8_ = 0;
  local_768._4_4_ = local_cf8._0_4_;
  local_768._8_4_ = 0;
  pIVar6 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_940]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                       *)&local_cf8,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_958._M_first);
  local_768._M_first._M_storage.super_IdBlockBase<int>.mDepth = (int32_t)pIVar6;
  local_768._4_4_ = (undefined4)((ulong)pIVar6 >> 0x20);
  local_750 = 1;
  local_748 = local_938;
  uStack_740 = uStack_930;
  local_898 = local_7c8;
  puStack_890 = puStack_7c0;
  local_cf8._4_4_ = 0;
  _Stack_cf0._0_4_ = 0;
  _Stack_cf0._4_4_ = 0;
  _Stack_cf0._8_4_ = 0;
  uStack_87c = 0;
  uStack_884 = local_cf8._0_4_;
  uStack_880 = 0;
  local_874 = 0;
  pIVar6 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_7a0]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                       *)&local_cf8,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_7b8._M_first);
  local_888 = SUB84(pIVar6,0);
  uStack_884 = (undefined4)((ulong)pIVar6 >> 0x20);
  local_870 = 1;
  local_868 = local_798;
  puStack_860 = puStack_790;
  local_858 = local_788;
  uStack_850 = uStack_780;
  local_848 = local_778;
  puStack_840 = puStack_770;
  local_cf8._4_4_ = 0;
  _Stack_cf0._0_4_ = 0;
  _Stack_cf0._4_4_ = 0;
  _Stack_cf0._8_4_ = 0;
  local_824 = 0;
  uStack_82c = 0;
  uStack_834 = local_cf8._0_4_;
  uStack_830 = 0;
  pIVar6 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_750]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                       *)&local_cf8,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_768._M_first);
  local_838 = SUB84(pIVar6,0);
  uStack_834 = (undefined4)((ulong)pIVar6 >> 0x20);
  local_820 = 1;
  local_818 = local_748;
  uStack_810 = uStack_740;
  local_808 = &local_10f8;
  local_800 = &local_10d8;
  local_cf8._4_4_ = 0;
  _Stack_cf0._0_4_ = 0;
  _Stack_cf0._4_4_ = 0;
  _Stack_cf0._8_4_ = 0;
  local_10b8._M_first._M_storage.super_IdBlockBase<int>.mDepth = 0;
  local_10b8._12_8_ = 0;
  local_10b8._4_4_ = local_cf8._0_4_;
  local_10b8._8_4_ = 0;
  local_10b8._20_4_ = 0;
  local_10a0 = 0;
  pIVar6 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_10c0]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                       *)&local_cf8,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_800->_M_first);
  local_10b8._M_first._M_storage.super_IdBlockBase<int>.mDepth = (int32_t)pIVar6;
  local_10b8._4_4_ = (undefined4)((ulong)pIVar6 >> 0x20);
  local_10a0 = 1;
  local_cf8._4_4_ = 0;
  _Stack_cf0._0_4_ = 0;
  _Stack_cf0._4_4_ = 0;
  _Stack_cf0._8_4_ = 0;
  local_1098._M_first._M_storage.super_IdBlockBase<int>.mDepth = 0;
  local_1098._12_8_ = 0;
  local_1098._4_4_ = local_cf8._0_4_;
  local_1098._8_4_ = 0;
  local_1098._20_4_ = 0;
  local_1080 = 0;
  pIVar6 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_10e0]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                       *)&local_cf8,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_10f8._M_first);
  local_1098._M_first._M_storage.super_IdBlockBase<int>.mDepth = (int32_t)pIVar6;
  local_1098._4_4_ = (undefined4)((ulong)pIVar6 >> 0x20);
  local_1080 = 1;
  pIVar6 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_10a0]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                       *)&local_cf8,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_10b8._M_first);
  pIVar7 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_1080]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                       *)&local_cf8,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_1098._M_first);
  local_e18 = &matchit::impl::asPointer<mathiu::impl::Fraction>;
  local_e10 = &matchit::impl::deref;
  uStack_dfc = 0;
  uStack_e00 = 0;
  local_df4 = 0;
  local_e08 = SUB84(pIVar6,0);
  uStack_e04 = (undefined4)((ulong)pIVar6 >> 0x20);
  local_df0 = 1;
  local_cf8._4_4_ = 0;
  _Stack_cf0._0_4_ = 0;
  _Stack_cf0._4_4_ = 0;
  _Stack_cf0._8_4_ = 0;
  uStack_ddc = 0;
  uStack_de0 = 0;
  local_dd4 = 0;
  local_de8 = SUB84(pIVar7,0);
  uStack_de4 = (undefined4)((ulong)pIVar7 >> 0x20);
  local_dd0 = 1;
  local_dc8 = &matchit::impl::cast<bool>;
  local_dc0 = 1;
  pIVar6 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr[local_ea8]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                       *)&local_cf8,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_ec0._M_first);
  local_110._0_8_ = &matchit::impl::asPointer<int>;
  local_110._8_8_ = &matchit::impl::deref;
  local_cf8._4_4_ = 0;
  _Stack_cf0._0_4_ = 0;
  _Stack_cf0._4_4_ = 0;
  _Stack_cf0._8_4_ = 0;
  local_110._28_8_ = 0;
  local_110._24_4_ = 0;
  local_110._36_4_ = 0;
  local_110._16_4_ = SUB84(pIVar6,0);
  local_110._20_4_ = (undefined4)((ulong)pIVar6 >> 0x20);
  local_110[0x28] = '\x01';
  local_110._48_8_ = &matchit::impl::cast<bool>;
  local_110[0x38] = 1;
  matchit::impl::
  ds<matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Ds<matchit::impl::Id<int>,matchit::impl::Id<int>>>>>,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<int>>>>>
            (&local_d0,(impl *)&local_e18,
             (App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>
              *)local_110,
             (App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>
              *)0x0);
  matchit::impl::PatternPipable::operator|(&local_1b8,(PatternPipable *)&local_d0,p);
  local_db8 = local_1b8.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
              ._M_head_impl.mUnary;
  paStack_db0 = local_1b8.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                .
                super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                .
                super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
                ._M_head_impl.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
                .
                super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
                .
                super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>,_false>
                ._M_head_impl.mUnary;
  local_cf8._4_4_ = 0;
  _Stack_cf0._0_4_ = 0;
  _Stack_cf0._4_4_ = 0;
  _Stack_cf0._8_4_ = 0;
  uStack_d9c = 0;
  uStack_da4 = local_cf8._0_4_;
  uStack_da0 = 0;
  local_d94 = 0;
  pIVar6 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr
             [local_1b8.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
              ._M_head_impl.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>,_false>
              ._M_head_impl.mPattern.mBlock.
              super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
              ._M_index]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                       *)&local_cf8,
                      &local_1b8.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                       .
                       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                       .
                       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
                       ._M_head_impl.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
                       .
                       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
                       .
                       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>,_false>
                       ._M_head_impl.mPattern.mBlock);
  local_da8 = SUB84(pIVar6,0);
  uStack_da4 = (undefined4)((ulong)pIVar6 >> 0x20);
  local_d90 = 1;
  local_d88 = local_1b8.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
              ._M_head_impl.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
              .
              super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
              ._M_head_impl.mUnary;
  IStack_d80 = local_1b8.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
               .
               super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
               .
               super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
               ._M_head_impl.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl.mPattern;
  uStack_d7f = local_1b8.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
               .
               super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
               .
               super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_false>
               ._M_head_impl.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl._9_7_;
  local_d78 = local_1b8.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
              .
              super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
              ._M_head_impl.mUnary;
  paStack_d70 = local_1b8.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                .
                super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
                ._M_head_impl.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                .
                super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                .
                super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
                ._M_head_impl.mUnary;
  local_cf8._4_4_ = 0;
  _Stack_cf0._0_4_ = 0;
  _Stack_cf0._4_4_ = 0;
  _Stack_cf0._8_4_ = 0;
  local_d68 = 0;
  uStack_d5c = 0;
  uStack_d64 = local_cf8._0_4_;
  uStack_d60 = 0;
  local_d54 = 0;
  local_d50 = 0;
  pIVar6 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr
             [local_1b8.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
              .
              super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
              ._M_head_impl.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
              ._M_head_impl.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
              super__Tuple_impl<1UL,_matchit::impl::Id<int>_>.
              super__Head_base<1UL,_matchit::impl::Id<int>,_false>._M_head_impl.mBlock.
              super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
              ._M_index]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                       *)&local_cf8,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_1b8.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                       .
                       super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
                       ._M_head_impl.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                       .
                       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                       .
                       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
                       ._M_head_impl.mPattern);
  local_d68 = SUB84(pIVar6,0);
  uStack_d64 = (undefined4)((ulong)pIVar6 >> 0x20);
  local_d50 = 1;
  local_cf8._4_4_ = 0;
  _Stack_cf0._0_4_ = 0;
  _Stack_cf0._4_4_ = 0;
  _Stack_cf0._8_4_ = 0;
  local_d48 = 0;
  uStack_d3c = 0;
  uStack_d44 = local_cf8._0_4_;
  uStack_d40 = 0;
  local_d34 = 0;
  local_d30 = 0;
  pIVar6 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr
             [local_1b8.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
              .
              super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
              ._M_head_impl.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
              .
              super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
              .
              super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
              ._M_head_impl.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
              super__Head_base<0UL,_matchit::impl::Id<int>,_false>._M_head_impl.mBlock.
              super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
              super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
              ._M_index]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                       *)&local_cf8,
                      (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> *)
                      &local_1b8.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                       .
                       super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
                       ._M_head_impl.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                       .
                       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
                       .
                       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>,_false>
                       ._M_head_impl.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>.
                       super__Head_base<0UL,_matchit::impl::Id<int>,_false>);
  local_d48 = SUB84(pIVar6,0);
  uStack_d44 = (undefined4)((ulong)pIVar6 >> 0x20);
  local_d30 = 1;
  local_d28 = local_1b8.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
              .
              super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
              ._M_head_impl.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
              .
              super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
              ._M_head_impl.mUnary;
  IStack_d20 = local_1b8.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
               ._M_head_impl.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl.mPattern;
  uStack_d1f = local_1b8.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_false>
               ._M_head_impl.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl._9_7_;
  local_d18 = &local_10f8;
  local_d08 = &local_10d8;
  local_ac8 = local_1148;
  local_ac0 = local_1158;
  local_1188._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1188._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  lVar20 = 0;
  local_d10 = &local_ec0;
  memset(&local_cf8,0,0x220);
  puVar8 = local_c80;
  do {
    auVar25._8_4_ = (int)lVar20;
    auVar25._0_8_ = lVar20;
    auVar25._12_4_ = (int)((ulong)lVar20 >> 0x20);
    auVar41 = (auVar25 | _DAT_0021ca20) ^ _DAT_0021ca40;
    iVar23 = auVar41._0_4_;
    iVar40 = auVar41._8_4_;
    auVar75._4_4_ = iVar23;
    auVar75._0_4_ = iVar23;
    auVar75._8_4_ = iVar40;
    auVar75._12_4_ = iVar40;
    auVar107._0_4_ = -(uint)(iVar23 < -0x7fffffde);
    auVar107._4_4_ = -(uint)(iVar23 < -0x7fffffde);
    auVar107._8_4_ = -(uint)(iVar40 < -0x7fffffde);
    auVar107._12_4_ = -(uint)(iVar40 < -0x7fffffde);
    auVar42._0_4_ = -(uint)(auVar41._4_4_ == -0x80000000);
    auVar42._4_4_ = -(uint)(auVar41._4_4_ == -0x80000000);
    auVar42._8_4_ = -(uint)(auVar41._12_4_ == -0x80000000);
    auVar42._12_4_ = -(uint)(auVar41._12_4_ == -0x80000000);
    auVar42 = auVar42 & auVar107;
    auVar41 = pshuflw(auVar75,auVar42,0xe8);
    auVar41 = packssdw(auVar41,auVar41);
    if ((auVar41 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      puVar8[-0x70] = 0;
    }
    auVar41 = packssdw(auVar42,auVar42);
    auVar41 = packssdw(auVar41,auVar41);
    if ((auVar41._0_4_ >> 0x10 & 1) != 0) {
      puVar8[-0x60] = 0;
    }
    auVar41 = (auVar25 | _DAT_0021ca10) ^ _DAT_0021ca40;
    iVar23 = auVar41._0_4_;
    iVar40 = auVar41._8_4_;
    auVar76._4_4_ = iVar23;
    auVar76._0_4_ = iVar23;
    auVar76._8_4_ = iVar40;
    auVar76._12_4_ = iVar40;
    auVar108._0_4_ = -(uint)(iVar23 < -0x7fffffde);
    auVar108._4_4_ = -(uint)(iVar23 < -0x7fffffde);
    auVar108._8_4_ = -(uint)(iVar40 < -0x7fffffde);
    auVar108._12_4_ = -(uint)(iVar40 < -0x7fffffde);
    auVar43._0_4_ = -(uint)(auVar41._4_4_ == -0x80000000);
    auVar43._4_4_ = -(uint)(auVar41._4_4_ == -0x80000000);
    auVar43._8_4_ = -(uint)(auVar41._12_4_ == -0x80000000);
    auVar43._12_4_ = -(uint)(auVar41._12_4_ == -0x80000000);
    auVar43 = auVar43 & auVar108;
    auVar41 = packssdw(auVar76,auVar43);
    auVar41 = packssdw(auVar41,auVar41);
    if ((auVar41 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      puVar8[-0x50] = 0;
    }
    auVar41 = pshufhw(auVar43,auVar43,0x84);
    auVar41 = packssdw(auVar41,auVar41);
    if ((auVar41 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      puVar8[-0x40] = 0;
    }
    auVar41 = (auVar25 | _DAT_0021ca00) ^ _DAT_0021ca40;
    iVar23 = auVar41._0_4_;
    iVar40 = auVar41._8_4_;
    auVar77._4_4_ = iVar23;
    auVar77._0_4_ = iVar23;
    auVar77._8_4_ = iVar40;
    auVar77._12_4_ = iVar40;
    auVar109._0_4_ = -(uint)(iVar23 < -0x7fffffde);
    auVar109._4_4_ = -(uint)(iVar23 < -0x7fffffde);
    auVar109._8_4_ = -(uint)(iVar40 < -0x7fffffde);
    auVar109._12_4_ = -(uint)(iVar40 < -0x7fffffde);
    auVar44._0_4_ = -(uint)(auVar41._4_4_ == -0x80000000);
    auVar44._4_4_ = -(uint)(auVar41._4_4_ == -0x80000000);
    auVar44._8_4_ = -(uint)(auVar41._12_4_ == -0x80000000);
    auVar44._12_4_ = -(uint)(auVar41._12_4_ == -0x80000000);
    auVar44 = auVar44 & auVar109;
    auVar41 = pshuflw(auVar77,auVar44,0xe8);
    auVar41 = packssdw(auVar41,auVar41);
    if ((auVar41 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      puVar8[-0x30] = 0;
    }
    auVar41 = packssdw(auVar44,auVar44);
    auVar41 = packssdw(auVar41,auVar41);
    if ((auVar41 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      puVar8[-0x20] = 0;
    }
    auVar25 = (auVar25 | _DAT_0021c9f0) ^ _DAT_0021ca40;
    iVar23 = auVar25._0_4_;
    iVar40 = auVar25._8_4_;
    auVar45._4_4_ = iVar23;
    auVar45._0_4_ = iVar23;
    auVar45._8_4_ = iVar40;
    auVar45._12_4_ = iVar40;
    auVar78._0_4_ = -(uint)(iVar23 < -0x7fffffde);
    auVar78._4_4_ = -(uint)(iVar23 < -0x7fffffde);
    auVar78._8_4_ = -(uint)(iVar40 < -0x7fffffde);
    auVar78._12_4_ = -(uint)(iVar40 < -0x7fffffde);
    auVar41._0_4_ = -(uint)(auVar25._4_4_ == -0x80000000);
    auVar41._4_4_ = -(uint)(auVar25._4_4_ == -0x80000000);
    auVar41._8_4_ = -(uint)(auVar25._12_4_ == -0x80000000);
    auVar41._12_4_ = -(uint)(auVar25._12_4_ == -0x80000000);
    auVar41 = auVar41 & auVar78;
    auVar25 = packssdw(auVar45,auVar41);
    auVar25 = packssdw(auVar25,auVar25);
    dVar24 = auVar25._0_8_;
    if ((auVar25 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      puVar8[-0x10] = 0;
    }
    auVar25 = pshufhw(auVar41,auVar41,0x84);
    auVar25 = packssdw(auVar25,auVar25);
    if ((auVar25 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *puVar8 = 0;
    }
    lVar20 = lVar20 + 8;
    puVar8 = puVar8 + 0x80;
  } while (lVar20 != 0x28);
  local_1148 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)0x8000000080000000;
  iStack_1140 = -0x80000000;
  iStack_113c = -0x80000000;
  local_1158 = (ExprPtr *)0x8000002280000022;
  iStack_1150 = -0x7fffffde;
  iStack_114c = -0x7fffffde;
  local_ad8 = 0;
  local_1178 = (PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:521:78)>
                *)0x0;
  if (*(char *)&(((_Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::And<matchit::impl::Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:304:9)>,_matchit::impl::Id<int>_>_>_>_>_>
                   *)&(local_1168->mPattern).mPatterns.
                      super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                      .
                      super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                 )->
                super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::And<matchit::impl::Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:304:9)>,_matchit::impl::Id<int>_>_>_>_>,_false>
                )._M_head_impl.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::And<matchit::impl::Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:304:9)>,_matchit::impl::Id<int>_>_>_>
                .
                super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::And<matchit::impl::Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:304:9)>,_matchit::impl::Id<int>_>_>_>
                .
                super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::And<matchit::impl::Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:304:9)>,_matchit::impl::Id<int>_>_>,_false>
                ._M_head_impl.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:304:9)>,_matchit::impl::Id<int>_>
                .
                super__Head_base<0UL,_matchit::impl::Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:304:9)>,_false>
                ._M_head_impl.super_anon_class_16_2_9473206a.u == '\t') {
    local_1178 = local_1168;
  }
  std::
  variant<std::monostate,mathiu::impl::Power_const*,mathiu::impl::Product_const*,mathiu::impl::Fraction_const*,int_const*,bool>
  ::operator=((variant<std::monostate,mathiu::impl::Power_const*,mathiu::impl::Product_const*,mathiu::impl::Fraction_const*,int_const*,bool>
               *)&local_cf8,(Power **)&local_1178);
  lVar20 = local_ad8 * 2;
  local_ad8 = local_ad8 + 1;
  value = std::
          get<1ul,std::monostate,mathiu::impl::Power_const*,mathiu::impl::Product_const*,mathiu::impl::Fraction_const*,int_const*,bool>
                    ((variant<std::monostate,_const_mathiu::impl::Power_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::Fraction_*,_const_int_*,_bool>
                      *)(&local_cf8 + lVar20));
  bVar4 = matchit::impl::
          PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
          ::
          matchPatternImpl<mathiu::impl::Power_const*&,matchit::impl::Context<mathiu::impl::Power_const*,bool,int_const*,bool,mathiu::impl::Product_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool>>
                    (value,&local_620,3,
                     (Context<const_mathiu::impl::Power_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Product_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool>
                      *)&local_cf8);
  if (bVar4) {
    eVar5 = matchit::impl::
            matchPattern<mathiu::impl::Power_const&,matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>,matchit::impl::Context<mathiu::impl::Power_const*,bool,int_const*,bool,mathiu::impl::Product_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool>>
                      (*value,(Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                               *)&local_670,4,
                       (Context<const_mathiu::impl::Power_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Product_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool>
                        *)&local_cf8);
    IVar19 = (IdProcess)eVar5;
    idPat = &local_670.
             super__Head_base<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
    ;
    matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
    processIdImpl(&idPat->_M_head_impl,3,IVar19);
    matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
    processIdImpl((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_670,3,(uint)eVar5);
    matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
    processIdImpl(&idPat->_M_head_impl,2,IVar19);
    matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
    processIdImpl((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_670,2,IVar19);
    matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
    processIdImpl(&idPat->_M_head_impl,1,IVar19);
    matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
    processIdImpl((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_670,1,IVar19);
    if (!eVar5) goto LAB_0018c9a4;
    bVar4 = matchit::impl::
            matchPattern<mathiu::impl::Expr_const&,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Wildcard>>>,matchit::impl::Context<mathiu::impl::Power_const*,bool,int_const*,bool,mathiu::impl::Product_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool>>
                      ((Expr *)local_1160,&local_6a8,1,
                       (Context<const_mathiu::impl::Power_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Product_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool>
                        *)&local_cf8);
  }
  else {
    pIVar9 = &std::
              visit<matchit::impl::Overload<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>&)_1_,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*)_1_>,std::variant<matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*>&>
                        ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                          *)&local_1178,
                         (variant<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                          *)&local_670.
                             super__Head_base<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
                        )->super_IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>;
    matchit::impl::IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>::reset(pIVar9,2);
    pIVar9 = &std::
              visit<matchit::impl::Overload<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>&)_1_,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*)_1_>,std::variant<matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*>&>
                        ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                          *)&local_1178,
                         (variant<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                          *)&local_670)->
              super_IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>;
    matchit::impl::IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>::reset(pIVar9,2);
    pIVar9 = &std::
              visit<matchit::impl::Overload<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>&)_1_,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*)_1_>,std::variant<matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*>&>
                        ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                          *)&local_1178,
                         (variant<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                          *)&local_670.
                             super__Head_base<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
                        )->super_IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>;
    matchit::impl::IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>::reset(pIVar9,1);
    pIVar9 = &std::
              visit<matchit::impl::Overload<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>&)_1_,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*)_1_>,std::variant<matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*>&>
                        ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                          *)&local_1178,
                         (variant<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                          *)&local_670)->
              super_IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>;
    matchit::impl::IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>::reset(pIVar9,1);
LAB_0018c9a4:
    bVar4 = false;
  }
  matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
  processIdImpl(&local_670.
                 super__Head_base<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
                 ._M_head_impl,0,(uint)bVar4);
  matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
  processIdImpl((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_670,0,(uint)bVar4);
  if (bVar4 != kCANCEL) {
    pIVar10 = std::
              visit<matchit::impl::Overload<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>&)_1_,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*)_1_>,std::variant<matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*>&>
                        ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                          *)&local_1178,
                         (variant<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                          *)local_610);
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__deduce_visit_result<const_std::shared_ptr<const_mathiu::impl::Expr>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1186:30),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1187:33),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1188:33),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1189:33)>_&&,_const_std::variant<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>_&>
      ::_S_vtable._M_arr
      [(pIVar10->super_IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>).mVariant.
       super__Variant_base<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
       .
       super__Move_assign_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
       .
       super__Copy_assign_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
       .
       super__Move_ctor_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
       .
       super__Copy_ctor_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
       .
       super__Variant_storage_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
       ._M_index]._M_data)
              ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>
                *)&local_1178,
               &(pIVar10->super_IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>).mVariant);
    pp_Var3 = local_608;
    pIVar10 = std::
              visit<matchit::impl::Overload<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>&)_1_,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*)_1_>,std::variant<matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*>&>
                        ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                          *)&local_1118,
                         (variant<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                          *)*local_608);
    lhs = (*std::__detail::__variant::
            __gen_vtable<std::__detail::__variant::__deduce_visit_result<const_std::shared_ptr<const_mathiu::impl::Expr>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1186:30),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1187:33),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1188:33),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1189:33)>_&&,_const_std::variant<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>_&>
            ::_S_vtable._M_arr
            [(pIVar10->super_IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>).mVariant.
             super__Variant_base<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
             .
             super__Move_assign_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
             .
             super__Copy_assign_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
             .
             super__Move_ctor_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
             .
             super__Copy_ctor_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
             .
             super__Variant_storage_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
             ._M_index]._M_data)
                    ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>
                      *)&local_1118,
                     &(pIVar10->super_IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>).
                      mVariant);
    operator*((impl *)&local_1178,lhs,(ExprPtr *)pp_Var3[1]);
    pow((impl *)&local_1118,__x_00,dVar24);
    if (local_1170 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1170);
    }
    local_1188._0_8_ = local_1118;
    local_1188._8_8_ = p_Stack_1110;
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1188._0_8_;
    _Var15._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1188._8_8_;
    goto LAB_0018d9cd;
  }
  lVar20 = 0;
  memset(&local_cf8,0,0x220);
  puVar8 = local_c80;
  do {
    auVar26._8_4_ = (int)lVar20;
    auVar26._0_8_ = lVar20;
    auVar26._12_4_ = (int)((ulong)lVar20 >> 0x20);
    auVar25 = (auVar26 | _DAT_0021ca20) ^ _DAT_0021ca40;
    iVar23 = auVar25._0_4_;
    iVar40 = auVar25._8_4_;
    auVar79._4_4_ = iVar23;
    auVar79._0_4_ = iVar23;
    auVar79._8_4_ = iVar40;
    auVar79._12_4_ = iVar40;
    auVar110._0_4_ = -(uint)(iVar23 < (int)local_1158);
    auVar110._4_4_ = -(uint)(iVar23 < local_1158._4_4_);
    auVar110._8_4_ = -(uint)(iVar40 < iStack_1150);
    auVar110._12_4_ = -(uint)(iVar40 < iStack_114c);
    auVar46._0_4_ = -(uint)(auVar25._4_4_ == (int)local_1148);
    auVar46._4_4_ = -(uint)(auVar25._4_4_ == local_1148._4_4_);
    auVar46._8_4_ = -(uint)(auVar25._12_4_ == iStack_1140);
    auVar46._12_4_ = -(uint)(auVar25._12_4_ == iStack_113c);
    auVar46 = auVar46 & auVar110;
    auVar25 = pshuflw(auVar79,auVar46,0xe8);
    auVar25 = packssdw(auVar25,auVar25);
    if ((auVar25 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      puVar8[-0x70] = 0;
    }
    auVar25 = packssdw(auVar46,auVar46);
    auVar25 = packssdw(auVar25,auVar25);
    if ((auVar25._0_4_ >> 0x10 & 1) != 0) {
      puVar8[-0x60] = 0;
    }
    auVar25 = (auVar26 | _DAT_0021ca10) ^ _DAT_0021ca40;
    iVar23 = auVar25._0_4_;
    iVar40 = auVar25._8_4_;
    auVar80._4_4_ = iVar23;
    auVar80._0_4_ = iVar23;
    auVar80._8_4_ = iVar40;
    auVar80._12_4_ = iVar40;
    auVar111._0_4_ = -(uint)(iVar23 < (int)local_1158);
    auVar111._4_4_ = -(uint)(iVar23 < local_1158._4_4_);
    auVar111._8_4_ = -(uint)(iVar40 < iStack_1150);
    auVar111._12_4_ = -(uint)(iVar40 < iStack_114c);
    auVar47._0_4_ = -(uint)(auVar25._4_4_ == (int)local_1148);
    auVar47._4_4_ = -(uint)(auVar25._4_4_ == local_1148._4_4_);
    auVar47._8_4_ = -(uint)(auVar25._12_4_ == iStack_1140);
    auVar47._12_4_ = -(uint)(auVar25._12_4_ == iStack_113c);
    auVar47 = auVar47 & auVar111;
    auVar25 = packssdw(auVar80,auVar47);
    auVar25 = packssdw(auVar25,auVar25);
    if ((auVar25 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      puVar8[-0x50] = 0;
    }
    auVar25 = pshufhw(auVar47,auVar47,0x84);
    auVar25 = packssdw(auVar25,auVar25);
    if ((auVar25 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      puVar8[-0x40] = 0;
    }
    auVar25 = (auVar26 | _DAT_0021ca00) ^ _DAT_0021ca40;
    iVar23 = auVar25._0_4_;
    iVar40 = auVar25._8_4_;
    auVar81._4_4_ = iVar23;
    auVar81._0_4_ = iVar23;
    auVar81._8_4_ = iVar40;
    auVar81._12_4_ = iVar40;
    auVar112._0_4_ = -(uint)(iVar23 < (int)local_1158);
    auVar112._4_4_ = -(uint)(iVar23 < local_1158._4_4_);
    auVar112._8_4_ = -(uint)(iVar40 < iStack_1150);
    auVar112._12_4_ = -(uint)(iVar40 < iStack_114c);
    auVar48._0_4_ = -(uint)(auVar25._4_4_ == (int)local_1148);
    auVar48._4_4_ = -(uint)(auVar25._4_4_ == local_1148._4_4_);
    auVar48._8_4_ = -(uint)(auVar25._12_4_ == iStack_1140);
    auVar48._12_4_ = -(uint)(auVar25._12_4_ == iStack_113c);
    auVar48 = auVar48 & auVar112;
    auVar25 = pshuflw(auVar81,auVar48,0xe8);
    auVar25 = packssdw(auVar25,auVar25);
    if ((auVar25 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      puVar8[-0x30] = 0;
    }
    auVar25 = packssdw(auVar48,auVar48);
    auVar25 = packssdw(auVar25,auVar25);
    if ((auVar25 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      puVar8[-0x20] = 0;
    }
    auVar25 = (auVar26 | _DAT_0021c9f0) ^ _DAT_0021ca40;
    iVar23 = auVar25._0_4_;
    iVar40 = auVar25._8_4_;
    auVar49._4_4_ = iVar23;
    auVar49._0_4_ = iVar23;
    auVar49._8_4_ = iVar40;
    auVar49._12_4_ = iVar40;
    auVar82._0_4_ = -(uint)(iVar23 < (int)local_1158);
    auVar82._4_4_ = -(uint)(iVar23 < local_1158._4_4_);
    auVar82._8_4_ = -(uint)(iVar40 < iStack_1150);
    auVar82._12_4_ = -(uint)(iVar40 < iStack_114c);
    auVar27._0_4_ = -(uint)(auVar25._4_4_ == (int)local_1148);
    auVar27._4_4_ = -(uint)(auVar25._4_4_ == local_1148._4_4_);
    auVar27._8_4_ = -(uint)(auVar25._12_4_ == iStack_1140);
    auVar27._12_4_ = -(uint)(auVar25._12_4_ == iStack_113c);
    auVar27 = auVar27 & auVar82;
    auVar25 = packssdw(auVar49,auVar27);
    auVar50 = packssdw(auVar25,auVar25);
    if ((auVar50 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      puVar8[-0x10] = 0;
    }
    auVar25 = pshufhw(auVar27,auVar27,0x84);
    auVar25 = packssdw(auVar25,auVar25);
    if ((auVar25 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *puVar8 = 0;
    }
    lVar20 = lVar20 + 8;
    puVar8 = puVar8 + 0x80;
  } while (lVar20 != 0x28);
  local_ad8 = 0;
  local_1178 = (PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:521:78)>
                *)0x0;
  if (*(char *)&(((_Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::And<matchit::impl::Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:304:9)>,_matchit::impl::Id<int>_>_>_>_>_>
                   *)&(local_1168->mPattern).mPatterns.
                      super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                      .
                      super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                 )->
                super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::And<matchit::impl::Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:304:9)>,_matchit::impl::Id<int>_>_>_>_>,_false>
                )._M_head_impl.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::And<matchit::impl::Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:304:9)>,_matchit::impl::Id<int>_>_>_>
                .
                super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::And<matchit::impl::Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:304:9)>,_matchit::impl::Id<int>_>_>_>
                .
                super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::And<matchit::impl::Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:304:9)>,_matchit::impl::Id<int>_>_>,_false>
                ._M_head_impl.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:304:9)>,_matchit::impl::Id<int>_>
                .
                super__Head_base<0UL,_matchit::impl::Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:304:9)>,_false>
                ._M_head_impl.super_anon_class_16_2_9473206a.u == '\b') {
    local_1178 = local_1168;
  }
  std::
  variant<std::monostate,mathiu::impl::Power_const*,mathiu::impl::Product_const*,mathiu::impl::Fraction_const*,int_const*,bool>
  ::operator=((variant<std::monostate,mathiu::impl::Power_const*,mathiu::impl::Product_const*,mathiu::impl::Fraction_const*,int_const*,bool>
               *)&local_cf8,(Product **)&local_1178);
  lVar20 = local_ad8 * 2;
  local_ad8 = local_ad8 + 1;
  value_00 = std::
             get<2ul,std::monostate,mathiu::impl::Power_const*,mathiu::impl::Product_const*,mathiu::impl::Fraction_const*,int_const*,bool>
                       ((variant<std::monostate,_const_mathiu::impl::Power_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::Fraction_*,_const_int_*,_bool>
                         *)(&local_cf8 + lVar20));
  bVar4 = matchit::impl::
          PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
          ::
          matchPatternImpl<mathiu::impl::Product_const*&,matchit::impl::Context<mathiu::impl::Power_const*,bool,int_const*,bool,mathiu::impl::Product_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool>>
                    (value_00,&local_9d8,3,
                     (Context<const_mathiu::impl::Power_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Product_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool>
                      *)&local_cf8);
  if (bVar4) {
    bVar4 = matchit::impl::Id<mathiu::impl::Product>::matchValue<mathiu::impl::Product_const&>
                      ((Id<mathiu::impl::Product> *)&local_a20,*value_00);
    IVar19 = (IdProcess)bVar4;
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Product>_>::processIdImpl
              ((Id<mathiu::impl::Product> *)&local_a20,4,IVar19);
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Product>_>::processIdImpl
              ((Id<mathiu::impl::Product> *)&local_a20,3,(uint)bVar4);
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Product>_>::processIdImpl
              ((Id<mathiu::impl::Product> *)&local_a20,2,IVar19);
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Product>_>::processIdImpl
              ((Id<mathiu::impl::Product> *)&local_a20,1,IVar19);
    if (!bVar4) goto LAB_0018cd74;
    bVar4 = matchit::impl::
            matchPattern<mathiu::impl::Expr_const&,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Wildcard>>>,matchit::impl::Context<mathiu::impl::Power_const*,bool,int_const*,bool,mathiu::impl::Product_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool>>
                      ((Expr *)local_1160,&local_a58,1,
                       (Context<const_mathiu::impl::Power_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Product_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool>
                        *)&local_cf8);
  }
  else {
    pIVar11 = &std::
               visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Product>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Product>&)_1_,matchit::impl::Id<mathiu::impl::Product>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Product>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Product>,matchit::impl::IdBlock<mathiu::impl::Product>*>&>
                         ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                           *)&local_1178,
                          (variant<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                           *)&local_a20)->super_IdBlockBase<mathiu::impl::Product>;
    matchit::impl::IdBlockBase<mathiu::impl::Product>::reset(pIVar11,2);
    pIVar11 = &std::
               visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Product>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Product>&)_1_,matchit::impl::Id<mathiu::impl::Product>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Product>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Product>,matchit::impl::IdBlock<mathiu::impl::Product>*>&>
                         ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                           *)&local_1178,
                          (variant<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                           *)&local_a20)->super_IdBlockBase<mathiu::impl::Product>;
    matchit::impl::IdBlockBase<mathiu::impl::Product>::reset(pIVar11,1);
LAB_0018cd74:
    bVar4 = false;
  }
  matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Product>_>::processIdImpl
            ((Id<mathiu::impl::Product> *)&local_a20,0,(uint)bVar4);
  if (bVar4 == false) {
    lVar20 = 0;
    memset(&local_cf8,0,0x220);
    puVar8 = local_c80;
    do {
      auVar28._8_4_ = (int)lVar20;
      auVar28._0_8_ = lVar20;
      auVar28._12_4_ = (int)((ulong)lVar20 >> 0x20);
      auVar25 = (auVar28 | _DAT_0021ca20) ^ _DAT_0021ca40;
      iVar23 = auVar25._0_4_;
      iVar40 = auVar25._8_4_;
      auVar83._4_4_ = iVar23;
      auVar83._0_4_ = iVar23;
      auVar83._8_4_ = iVar40;
      auVar83._12_4_ = iVar40;
      auVar113._0_4_ = -(uint)(iVar23 < (int)local_1158);
      auVar113._4_4_ = -(uint)(iVar23 < local_1158._4_4_);
      auVar113._8_4_ = -(uint)(iVar40 < iStack_1150);
      auVar113._12_4_ = -(uint)(iVar40 < iStack_114c);
      auVar51._0_4_ = -(uint)(auVar25._4_4_ == (int)local_1148);
      auVar51._4_4_ = -(uint)(auVar25._4_4_ == local_1148._4_4_);
      auVar51._8_4_ = -(uint)(auVar25._12_4_ == iStack_1140);
      auVar51._12_4_ = -(uint)(auVar25._12_4_ == iStack_113c);
      auVar51 = auVar51 & auVar113;
      auVar25 = pshuflw(auVar83,auVar51,0xe8);
      auVar25 = packssdw(auVar25,auVar25);
      if ((auVar25 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        puVar8[-0x70] = 0;
      }
      auVar25 = packssdw(auVar51,auVar51);
      auVar25 = packssdw(auVar25,auVar25);
      if ((auVar25._0_4_ >> 0x10 & 1) != 0) {
        puVar8[-0x60] = 0;
      }
      auVar25 = (auVar28 | _DAT_0021ca10) ^ _DAT_0021ca40;
      iVar23 = auVar25._0_4_;
      iVar40 = auVar25._8_4_;
      auVar84._4_4_ = iVar23;
      auVar84._0_4_ = iVar23;
      auVar84._8_4_ = iVar40;
      auVar84._12_4_ = iVar40;
      auVar114._0_4_ = -(uint)(iVar23 < (int)local_1158);
      auVar114._4_4_ = -(uint)(iVar23 < local_1158._4_4_);
      auVar114._8_4_ = -(uint)(iVar40 < iStack_1150);
      auVar114._12_4_ = -(uint)(iVar40 < iStack_114c);
      auVar52._0_4_ = -(uint)(auVar25._4_4_ == (int)local_1148);
      auVar52._4_4_ = -(uint)(auVar25._4_4_ == local_1148._4_4_);
      auVar52._8_4_ = -(uint)(auVar25._12_4_ == iStack_1140);
      auVar52._12_4_ = -(uint)(auVar25._12_4_ == iStack_113c);
      auVar52 = auVar52 & auVar114;
      auVar25 = packssdw(auVar84,auVar52);
      auVar25 = packssdw(auVar25,auVar25);
      if ((auVar25 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        puVar8[-0x50] = 0;
      }
      auVar25 = pshufhw(auVar52,auVar52,0x84);
      auVar25 = packssdw(auVar25,auVar25);
      if ((auVar25 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        puVar8[-0x40] = 0;
      }
      auVar25 = (auVar28 | _DAT_0021ca00) ^ _DAT_0021ca40;
      iVar23 = auVar25._0_4_;
      iVar40 = auVar25._8_4_;
      auVar85._4_4_ = iVar23;
      auVar85._0_4_ = iVar23;
      auVar85._8_4_ = iVar40;
      auVar85._12_4_ = iVar40;
      auVar115._0_4_ = -(uint)(iVar23 < (int)local_1158);
      auVar115._4_4_ = -(uint)(iVar23 < local_1158._4_4_);
      auVar115._8_4_ = -(uint)(iVar40 < iStack_1150);
      auVar115._12_4_ = -(uint)(iVar40 < iStack_114c);
      auVar53._0_4_ = -(uint)(auVar25._4_4_ == (int)local_1148);
      auVar53._4_4_ = -(uint)(auVar25._4_4_ == local_1148._4_4_);
      auVar53._8_4_ = -(uint)(auVar25._12_4_ == iStack_1140);
      auVar53._12_4_ = -(uint)(auVar25._12_4_ == iStack_113c);
      auVar53 = auVar53 & auVar115;
      auVar25 = pshuflw(auVar85,auVar53,0xe8);
      auVar25 = packssdw(auVar25,auVar25);
      if ((auVar25 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        puVar8[-0x30] = 0;
      }
      auVar25 = packssdw(auVar53,auVar53);
      auVar25 = packssdw(auVar25,auVar25);
      if ((auVar25 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        puVar8[-0x20] = 0;
      }
      auVar25 = (auVar28 | _DAT_0021c9f0) ^ _DAT_0021ca40;
      iVar23 = auVar25._0_4_;
      iVar40 = auVar25._8_4_;
      auVar54._4_4_ = iVar23;
      auVar54._0_4_ = iVar23;
      auVar54._8_4_ = iVar40;
      auVar54._12_4_ = iVar40;
      auVar86._0_4_ = -(uint)(iVar23 < (int)local_1158);
      auVar86._4_4_ = -(uint)(iVar23 < local_1158._4_4_);
      auVar86._8_4_ = -(uint)(iVar40 < iStack_1150);
      auVar86._12_4_ = -(uint)(iVar40 < iStack_114c);
      auVar29._0_4_ = -(uint)(auVar25._4_4_ == (int)local_1148);
      auVar29._4_4_ = -(uint)(auVar25._4_4_ == local_1148._4_4_);
      auVar29._8_4_ = -(uint)(auVar25._12_4_ == iStack_1140);
      auVar29._12_4_ = -(uint)(auVar25._12_4_ == iStack_113c);
      auVar29 = auVar29 & auVar86;
      auVar25 = packssdw(auVar54,auVar29);
      auVar25 = packssdw(auVar25,auVar25);
      if ((auVar25 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        puVar8[-0x10] = 0;
      }
      auVar25 = pshufhw(auVar29,auVar29,0x84);
      auVar25 = packssdw(auVar25,auVar25);
      if ((auVar25 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *puVar8 = 0;
      }
      lVar20 = lVar20 + 8;
      puVar8 = puVar8 + 0x80;
    } while (lVar20 != 0x28);
    local_ad8 = 0;
    bVar4 = matchit::impl::
            matchPattern<mathiu::impl::Expr_const&,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,int>>>,matchit::impl::Context<mathiu::impl::Power_const*,bool,int_const*,bool,mathiu::impl::Product_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool>>
                      ((Expr *)local_1168,&local_e50,2,
                       (Context<const_mathiu::impl::Power_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Product_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool>
                        *)&local_cf8);
    if (bVar4) {
      bVar4 = matchit::impl::
              matchPattern<mathiu::impl::Expr_const&,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Wildcard>>>,matchit::impl::Context<mathiu::impl::Power_const*,bool,int_const*,bool,mathiu::impl::Product_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool>>
                        ((Expr *)local_1160,&local_e78,3,
                         (Context<const_mathiu::impl::Power_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Product_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool>
                          *)&local_cf8);
      if (!bVar4) {
        local_1178 = (PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:521:78)>
                      *)0x0;
        if (*(char *)&(((_Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::And<matchit::impl::Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:304:9)>,_matchit::impl::Id<int>_>_>_>_>_>
                         *)&(local_1160->mPattern).mPatterns.
                            super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                            .
                            super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                       )->
                      super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::And<matchit::impl::Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:304:9)>,_matchit::impl::Id<int>_>_>_>_>,_false>
                      )._M_head_impl.mPattern.mPatterns.
                      super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::And<matchit::impl::Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:304:9)>,_matchit::impl::Id<int>_>_>_>
                      .
                      super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::And<matchit::impl::Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:304:9)>,_matchit::impl::Id<int>_>_>_>
                      .
                      super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::And<matchit::impl::Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:304:9)>,_matchit::impl::Id<int>_>_>,_false>
                      ._M_head_impl.mPattern.mPatterns.
                      super__Tuple_impl<0UL,_matchit::impl::Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:304:9)>,_matchit::impl::Id<int>_>
                      .
                      super__Head_base<0UL,_matchit::impl::Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:304:9)>,_false>
                      ._M_head_impl.super_anon_class_16_2_9473206a.u == '\x01') {
          local_1178 = local_1160;
        }
        std::
        variant<std::monostate,mathiu::impl::Power_const*,mathiu::impl::Product_const*,mathiu::impl::Fraction_const*,int_const*,bool>
        ::operator=((variant<std::monostate,mathiu::impl::Power_const*,mathiu::impl::Product_const*,mathiu::impl::Fraction_const*,int_const*,bool>
                     *)(&local_cf8 + local_ad8 * 2),(Fraction **)&local_1178);
        lVar20 = local_ad8 * 2;
        local_ad8 = local_ad8 + 1;
        value_01 = std::
                   get<3ul,std::monostate,mathiu::impl::Power_const*,mathiu::impl::Product_const*,mathiu::impl::Fraction_const*,int_const*,bool>
                             ((variant<std::monostate,_const_mathiu::impl::Power_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::Fraction_*,_const_int_*,_bool>
                               *)(&local_cf8 + lVar20));
        bVar4 = matchit::impl::
                PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
                ::
                matchPatternImpl<mathiu::impl::Fraction_const*&,matchit::impl::Context<mathiu::impl::Power_const*,bool,int_const*,bool,mathiu::impl::Product_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool>>
                          (value_01,&local_e88,5,
                           (Context<const_mathiu::impl::Power_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Product_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool>
                            *)&local_cf8);
        if (!bVar4) goto LAB_0018d183;
      }
      dVar24 = evald(local_e28);
      pp_Var16 = local_e20;
      if (dVar24 <= 0.0) goto LAB_0018d183;
    }
    else {
LAB_0018d183:
      lVar20 = 0;
      memset(&local_cf8,0,0x220);
      puVar8 = local_c80;
      do {
        auVar30._8_4_ = (int)lVar20;
        auVar30._0_8_ = lVar20;
        auVar30._12_4_ = (int)((ulong)lVar20 >> 0x20);
        auVar25 = (auVar30 | _DAT_0021ca20) ^ _DAT_0021ca40;
        iVar23 = auVar25._0_4_;
        iVar40 = auVar25._8_4_;
        auVar87._4_4_ = iVar23;
        auVar87._0_4_ = iVar23;
        auVar87._8_4_ = iVar40;
        auVar87._12_4_ = iVar40;
        auVar116._0_4_ = -(uint)(iVar23 < (int)local_1158);
        auVar116._4_4_ = -(uint)(iVar23 < local_1158._4_4_);
        auVar116._8_4_ = -(uint)(iVar40 < iStack_1150);
        auVar116._12_4_ = -(uint)(iVar40 < iStack_114c);
        auVar55._0_4_ = -(uint)(auVar25._4_4_ == (int)local_1148);
        auVar55._4_4_ = -(uint)(auVar25._4_4_ == local_1148._4_4_);
        auVar55._8_4_ = -(uint)(auVar25._12_4_ == iStack_1140);
        auVar55._12_4_ = -(uint)(auVar25._12_4_ == iStack_113c);
        auVar55 = auVar55 & auVar116;
        auVar25 = pshuflw(auVar87,auVar55,0xe8);
        auVar25 = packssdw(auVar25,auVar25);
        if ((auVar25 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          puVar8[-0x70] = 0;
        }
        auVar25 = packssdw(auVar55,auVar55);
        auVar25 = packssdw(auVar25,auVar25);
        if ((auVar25._0_4_ >> 0x10 & 1) != 0) {
          puVar8[-0x60] = 0;
        }
        auVar25 = (auVar30 | _DAT_0021ca10) ^ _DAT_0021ca40;
        iVar23 = auVar25._0_4_;
        iVar40 = auVar25._8_4_;
        auVar88._4_4_ = iVar23;
        auVar88._0_4_ = iVar23;
        auVar88._8_4_ = iVar40;
        auVar88._12_4_ = iVar40;
        auVar117._0_4_ = -(uint)(iVar23 < (int)local_1158);
        auVar117._4_4_ = -(uint)(iVar23 < local_1158._4_4_);
        auVar117._8_4_ = -(uint)(iVar40 < iStack_1150);
        auVar117._12_4_ = -(uint)(iVar40 < iStack_114c);
        auVar56._0_4_ = -(uint)(auVar25._4_4_ == (int)local_1148);
        auVar56._4_4_ = -(uint)(auVar25._4_4_ == local_1148._4_4_);
        auVar56._8_4_ = -(uint)(auVar25._12_4_ == iStack_1140);
        auVar56._12_4_ = -(uint)(auVar25._12_4_ == iStack_113c);
        auVar56 = auVar56 & auVar117;
        auVar25 = packssdw(auVar88,auVar56);
        auVar25 = packssdw(auVar25,auVar25);
        if ((auVar25 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          puVar8[-0x50] = 0;
        }
        auVar25 = pshufhw(auVar56,auVar56,0x84);
        auVar25 = packssdw(auVar25,auVar25);
        if ((auVar25 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          puVar8[-0x40] = 0;
        }
        auVar25 = (auVar30 | _DAT_0021ca00) ^ _DAT_0021ca40;
        iVar23 = auVar25._0_4_;
        iVar40 = auVar25._8_4_;
        auVar89._4_4_ = iVar23;
        auVar89._0_4_ = iVar23;
        auVar89._8_4_ = iVar40;
        auVar89._12_4_ = iVar40;
        auVar118._0_4_ = -(uint)(iVar23 < (int)local_1158);
        auVar118._4_4_ = -(uint)(iVar23 < local_1158._4_4_);
        auVar118._8_4_ = -(uint)(iVar40 < iStack_1150);
        auVar118._12_4_ = -(uint)(iVar40 < iStack_114c);
        auVar57._0_4_ = -(uint)(auVar25._4_4_ == (int)local_1148);
        auVar57._4_4_ = -(uint)(auVar25._4_4_ == local_1148._4_4_);
        auVar57._8_4_ = -(uint)(auVar25._12_4_ == iStack_1140);
        auVar57._12_4_ = -(uint)(auVar25._12_4_ == iStack_113c);
        auVar57 = auVar57 & auVar118;
        auVar25 = pshuflw(auVar89,auVar57,0xe8);
        auVar25 = packssdw(auVar25,auVar25);
        if ((auVar25 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          puVar8[-0x30] = 0;
        }
        auVar25 = packssdw(auVar57,auVar57);
        auVar25 = packssdw(auVar25,auVar25);
        if ((auVar25 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          puVar8[-0x20] = 0;
        }
        auVar25 = (auVar30 | _DAT_0021c9f0) ^ _DAT_0021ca40;
        iVar23 = auVar25._0_4_;
        iVar40 = auVar25._8_4_;
        auVar58._4_4_ = iVar23;
        auVar58._0_4_ = iVar23;
        auVar58._8_4_ = iVar40;
        auVar58._12_4_ = iVar40;
        auVar90._0_4_ = -(uint)(iVar23 < (int)local_1158);
        auVar90._4_4_ = -(uint)(iVar23 < local_1158._4_4_);
        auVar90._8_4_ = -(uint)(iVar40 < iStack_1150);
        auVar90._12_4_ = -(uint)(iVar40 < iStack_114c);
        auVar31._0_4_ = -(uint)(auVar25._4_4_ == (int)local_1148);
        auVar31._4_4_ = -(uint)(auVar25._4_4_ == local_1148._4_4_);
        auVar31._8_4_ = -(uint)(auVar25._12_4_ == iStack_1140);
        auVar31._12_4_ = -(uint)(auVar25._12_4_ == iStack_113c);
        auVar31 = auVar31 & auVar90;
        auVar25 = packssdw(auVar58,auVar31);
        auVar25 = packssdw(auVar25,auVar25);
        if ((auVar25 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          puVar8[-0x10] = 0;
        }
        auVar25 = pshufhw(auVar31,auVar31,0x84);
        auVar25 = packssdw(auVar25,auVar25);
        if ((auVar25 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *puVar8 = 0;
        }
        lVar20 = lVar20 + 8;
        puVar8 = puVar8 + 0x80;
      } while (lVar20 != 0x28);
      local_ad8 = 0;
      bVar4 = matchit::impl::
              matchPattern<mathiu::impl::Expr_const&,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,int>>>,matchit::impl::Context<mathiu::impl::Power_const*,bool,int_const*,bool,mathiu::impl::Product_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool>>
                        ((Expr *)local_1168,&local_a88,1,
                         (Context<const_mathiu::impl::Power_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Product_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool>
                          *)&local_cf8);
      if (bVar4) {
        this_01 = (logic_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error((runtime_error *)this_01,"undefined!");
        pcVar18 = std::runtime_error::~runtime_error;
        puVar21 = &std::runtime_error::typeinfo;
LAB_0018dfaa:
        __cxa_throw(this_01,puVar21,pcVar18);
      }
      lVar20 = 0;
      memset(&local_cf8,0,0x220);
      puVar8 = local_c80;
      do {
        auVar32._8_4_ = (int)lVar20;
        auVar32._0_8_ = lVar20;
        auVar32._12_4_ = (int)((ulong)lVar20 >> 0x20);
        auVar25 = (auVar32 | _DAT_0021ca20) ^ _DAT_0021ca40;
        iVar23 = auVar25._0_4_;
        iVar40 = auVar25._8_4_;
        auVar91._4_4_ = iVar23;
        auVar91._0_4_ = iVar23;
        auVar91._8_4_ = iVar40;
        auVar91._12_4_ = iVar40;
        auVar119._0_4_ = -(uint)(iVar23 < (int)local_1158);
        auVar119._4_4_ = -(uint)(iVar23 < local_1158._4_4_);
        auVar119._8_4_ = -(uint)(iVar40 < iStack_1150);
        auVar119._12_4_ = -(uint)(iVar40 < iStack_114c);
        auVar59._0_4_ = -(uint)(auVar25._4_4_ == (int)local_1148);
        auVar59._4_4_ = -(uint)(auVar25._4_4_ == local_1148._4_4_);
        auVar59._8_4_ = -(uint)(auVar25._12_4_ == iStack_1140);
        auVar59._12_4_ = -(uint)(auVar25._12_4_ == iStack_113c);
        auVar59 = auVar59 & auVar119;
        auVar25 = pshuflw(auVar91,auVar59,0xe8);
        auVar25 = packssdw(auVar25,auVar25);
        if ((auVar25 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          puVar8[-0x70] = 0;
        }
        auVar25 = packssdw(auVar59,auVar59);
        auVar25 = packssdw(auVar25,auVar25);
        if ((auVar25._0_4_ >> 0x10 & 1) != 0) {
          puVar8[-0x60] = 0;
        }
        auVar25 = (auVar32 | _DAT_0021ca10) ^ _DAT_0021ca40;
        iVar23 = auVar25._0_4_;
        iVar40 = auVar25._8_4_;
        auVar92._4_4_ = iVar23;
        auVar92._0_4_ = iVar23;
        auVar92._8_4_ = iVar40;
        auVar92._12_4_ = iVar40;
        auVar120._0_4_ = -(uint)(iVar23 < (int)local_1158);
        auVar120._4_4_ = -(uint)(iVar23 < local_1158._4_4_);
        auVar120._8_4_ = -(uint)(iVar40 < iStack_1150);
        auVar120._12_4_ = -(uint)(iVar40 < iStack_114c);
        auVar60._0_4_ = -(uint)(auVar25._4_4_ == (int)local_1148);
        auVar60._4_4_ = -(uint)(auVar25._4_4_ == local_1148._4_4_);
        auVar60._8_4_ = -(uint)(auVar25._12_4_ == iStack_1140);
        auVar60._12_4_ = -(uint)(auVar25._12_4_ == iStack_113c);
        auVar60 = auVar60 & auVar120;
        auVar25 = packssdw(auVar92,auVar60);
        auVar25 = packssdw(auVar25,auVar25);
        if ((auVar25 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          puVar8[-0x50] = 0;
        }
        auVar25 = pshufhw(auVar60,auVar60,0x84);
        auVar25 = packssdw(auVar25,auVar25);
        if ((auVar25 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          puVar8[-0x40] = 0;
        }
        auVar25 = (auVar32 | _DAT_0021ca00) ^ _DAT_0021ca40;
        iVar23 = auVar25._0_4_;
        iVar40 = auVar25._8_4_;
        auVar93._4_4_ = iVar23;
        auVar93._0_4_ = iVar23;
        auVar93._8_4_ = iVar40;
        auVar93._12_4_ = iVar40;
        auVar121._0_4_ = -(uint)(iVar23 < (int)local_1158);
        auVar121._4_4_ = -(uint)(iVar23 < local_1158._4_4_);
        auVar121._8_4_ = -(uint)(iVar40 < iStack_1150);
        auVar121._12_4_ = -(uint)(iVar40 < iStack_114c);
        auVar61._0_4_ = -(uint)(auVar25._4_4_ == (int)local_1148);
        auVar61._4_4_ = -(uint)(auVar25._4_4_ == local_1148._4_4_);
        auVar61._8_4_ = -(uint)(auVar25._12_4_ == iStack_1140);
        auVar61._12_4_ = -(uint)(auVar25._12_4_ == iStack_113c);
        auVar61 = auVar61 & auVar121;
        auVar25 = pshuflw(auVar93,auVar61,0xe8);
        auVar25 = packssdw(auVar25,auVar25);
        if ((auVar25 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          puVar8[-0x30] = 0;
        }
        auVar25 = packssdw(auVar61,auVar61);
        auVar25 = packssdw(auVar25,auVar25);
        if ((auVar25 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          puVar8[-0x20] = 0;
        }
        auVar25 = (auVar32 | _DAT_0021c9f0) ^ _DAT_0021ca40;
        iVar23 = auVar25._0_4_;
        iVar40 = auVar25._8_4_;
        auVar62._4_4_ = iVar23;
        auVar62._0_4_ = iVar23;
        auVar62._8_4_ = iVar40;
        auVar62._12_4_ = iVar40;
        auVar94._0_4_ = -(uint)(iVar23 < (int)local_1158);
        auVar94._4_4_ = -(uint)(iVar23 < local_1158._4_4_);
        auVar94._8_4_ = -(uint)(iVar40 < iStack_1150);
        auVar94._12_4_ = -(uint)(iVar40 < iStack_114c);
        auVar33._0_4_ = -(uint)(auVar25._4_4_ == (int)local_1148);
        auVar33._4_4_ = -(uint)(auVar25._4_4_ == local_1148._4_4_);
        auVar33._8_4_ = -(uint)(auVar25._12_4_ == iStack_1140);
        auVar33._12_4_ = -(uint)(auVar25._12_4_ == iStack_113c);
        auVar33 = auVar33 & auVar94;
        auVar25 = packssdw(auVar62,auVar33);
        auVar25 = packssdw(auVar25,auVar25);
        if ((auVar25 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          puVar8[-0x10] = 0;
        }
        auVar25 = pshufhw(auVar33,auVar33,0x84);
        auVar25 = packssdw(auVar25,auVar25);
        if ((auVar25 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *puVar8 = 0;
        }
        lVar20 = lVar20 + 8;
        puVar8 = puVar8 + 0x80;
      } while (lVar20 != 0x28);
      local_ad8 = 0;
      bVar4 = matchit::impl::
              matchPattern<mathiu::impl::Expr_const&,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,int>>>,matchit::impl::Context<mathiu::impl::Power_const*,bool,int_const*,bool,mathiu::impl::Product_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool>>
                        ((Expr *)local_1168,&local_ab8,1,
                         (Context<const_mathiu::impl::Power_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Product_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool>
                          *)&local_cf8);
      if (bVar4) {
        _Var15._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
        (_Var15._M_pi)->_M_use_count = 1;
        (_Var15._M_pi)->_M_weak_count = 1;
        (_Var15._M_pi)->_vptr__Sp_counted_base =
             (_func_int **)&PTR___Sp_counted_ptr_inplace_00263778;
        *(undefined4 *)&_Var15._M_pi[1]._vptr__Sp_counted_base = 1;
        *(undefined1 *)&_Var15._M_pi[4]._M_use_count = 0;
        p_Var1 = _Var15._M_pi + 1;
        goto LAB_0018d9cd;
      }
      lVar20 = 0;
      memset(&local_cf8,0,0x220);
      puVar8 = local_c80;
      do {
        auVar34._8_4_ = (int)lVar20;
        auVar34._0_8_ = lVar20;
        auVar34._12_4_ = (int)((ulong)lVar20 >> 0x20);
        auVar25 = (auVar34 | _DAT_0021ca20) ^ _DAT_0021ca40;
        iVar23 = auVar25._0_4_;
        iVar40 = auVar25._8_4_;
        auVar95._4_4_ = iVar23;
        auVar95._0_4_ = iVar23;
        auVar95._8_4_ = iVar40;
        auVar95._12_4_ = iVar40;
        auVar122._0_4_ = -(uint)(iVar23 < (int)local_1158);
        auVar122._4_4_ = -(uint)(iVar23 < local_1158._4_4_);
        auVar122._8_4_ = -(uint)(iVar40 < iStack_1150);
        auVar122._12_4_ = -(uint)(iVar40 < iStack_114c);
        auVar63._0_4_ = -(uint)(auVar25._4_4_ == (int)local_1148);
        auVar63._4_4_ = -(uint)(auVar25._4_4_ == local_1148._4_4_);
        auVar63._8_4_ = -(uint)(auVar25._12_4_ == iStack_1140);
        auVar63._12_4_ = -(uint)(auVar25._12_4_ == iStack_113c);
        auVar63 = auVar63 & auVar122;
        auVar25 = pshuflw(auVar95,auVar63,0xe8);
        auVar25 = packssdw(auVar25,auVar25);
        if ((auVar25 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          puVar8[-0x70] = 0;
        }
        auVar25 = packssdw(auVar63,auVar63);
        auVar25 = packssdw(auVar25,auVar25);
        if ((auVar25._0_4_ >> 0x10 & 1) != 0) {
          puVar8[-0x60] = 0;
        }
        auVar25 = (auVar34 | _DAT_0021ca10) ^ _DAT_0021ca40;
        iVar23 = auVar25._0_4_;
        iVar40 = auVar25._8_4_;
        auVar96._4_4_ = iVar23;
        auVar96._0_4_ = iVar23;
        auVar96._8_4_ = iVar40;
        auVar96._12_4_ = iVar40;
        auVar123._0_4_ = -(uint)(iVar23 < (int)local_1158);
        auVar123._4_4_ = -(uint)(iVar23 < local_1158._4_4_);
        auVar123._8_4_ = -(uint)(iVar40 < iStack_1150);
        auVar123._12_4_ = -(uint)(iVar40 < iStack_114c);
        auVar64._0_4_ = -(uint)(auVar25._4_4_ == (int)local_1148);
        auVar64._4_4_ = -(uint)(auVar25._4_4_ == local_1148._4_4_);
        auVar64._8_4_ = -(uint)(auVar25._12_4_ == iStack_1140);
        auVar64._12_4_ = -(uint)(auVar25._12_4_ == iStack_113c);
        auVar64 = auVar64 & auVar123;
        auVar25 = packssdw(auVar96,auVar64);
        auVar25 = packssdw(auVar25,auVar25);
        if ((auVar25 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          puVar8[-0x50] = 0;
        }
        auVar25 = pshufhw(auVar64,auVar64,0x84);
        auVar25 = packssdw(auVar25,auVar25);
        if ((auVar25 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          puVar8[-0x40] = 0;
        }
        auVar25 = (auVar34 | _DAT_0021ca00) ^ _DAT_0021ca40;
        iVar23 = auVar25._0_4_;
        iVar40 = auVar25._8_4_;
        auVar97._4_4_ = iVar23;
        auVar97._0_4_ = iVar23;
        auVar97._8_4_ = iVar40;
        auVar97._12_4_ = iVar40;
        auVar124._0_4_ = -(uint)(iVar23 < (int)local_1158);
        auVar124._4_4_ = -(uint)(iVar23 < local_1158._4_4_);
        auVar124._8_4_ = -(uint)(iVar40 < iStack_1150);
        auVar124._12_4_ = -(uint)(iVar40 < iStack_114c);
        auVar65._0_4_ = -(uint)(auVar25._4_4_ == (int)local_1148);
        auVar65._4_4_ = -(uint)(auVar25._4_4_ == local_1148._4_4_);
        auVar65._8_4_ = -(uint)(auVar25._12_4_ == iStack_1140);
        auVar65._12_4_ = -(uint)(auVar25._12_4_ == iStack_113c);
        auVar65 = auVar65 & auVar124;
        auVar25 = pshuflw(auVar97,auVar65,0xe8);
        auVar25 = packssdw(auVar25,auVar25);
        if ((auVar25 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          puVar8[-0x30] = 0;
        }
        auVar25 = packssdw(auVar65,auVar65);
        auVar25 = packssdw(auVar25,auVar25);
        if ((auVar25 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          puVar8[-0x20] = 0;
        }
        auVar25 = (auVar34 | _DAT_0021c9f0) ^ _DAT_0021ca40;
        iVar23 = auVar25._0_4_;
        iVar40 = auVar25._8_4_;
        auVar66._4_4_ = iVar23;
        auVar66._0_4_ = iVar23;
        auVar66._8_4_ = iVar40;
        auVar66._12_4_ = iVar40;
        auVar98._0_4_ = -(uint)(iVar23 < (int)local_1158);
        auVar98._4_4_ = -(uint)(iVar23 < local_1158._4_4_);
        auVar98._8_4_ = -(uint)(iVar40 < iStack_1150);
        auVar98._12_4_ = -(uint)(iVar40 < iStack_114c);
        auVar35._0_4_ = -(uint)(auVar25._4_4_ == (int)local_1148);
        auVar35._4_4_ = -(uint)(auVar25._4_4_ == local_1148._4_4_);
        auVar35._8_4_ = -(uint)(auVar25._12_4_ == iStack_1140);
        auVar35._12_4_ = -(uint)(auVar25._12_4_ == iStack_113c);
        auVar35 = auVar35 & auVar98;
        auVar25 = packssdw(auVar66,auVar35);
        auVar25 = packssdw(auVar25,auVar25);
        if ((auVar25 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          puVar8[-0x10] = 0;
        }
        auVar25 = pshufhw(auVar35,auVar35,0x84);
        auVar25 = packssdw(auVar25,auVar25);
        if ((auVar25 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *puVar8 = 0;
        }
        lVar20 = lVar20 + 8;
        puVar8 = puVar8 + 0x80;
      } while (lVar20 != 0x28);
      local_ad8 = 0;
      bVar4 = matchit::impl::
              matchPattern<mathiu::impl::Expr_const&,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,int>>>,matchit::impl::Context<mathiu::impl::Power_const*,bool,int_const*,bool,mathiu::impl::Product_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool>>
                        ((Expr *)local_1160,&local_1018,1,
                         (Context<const_mathiu::impl::Power_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Product_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool>
                          *)&local_cf8);
      pp_Var16 = local_ff0;
      if (!bVar4) {
        lVar20 = 0;
        memset(&local_cf8,0,0x220);
        puVar8 = local_c80;
        do {
          auVar36._8_4_ = (int)lVar20;
          auVar36._0_8_ = lVar20;
          auVar36._12_4_ = (int)((ulong)lVar20 >> 0x20);
          auVar25 = (auVar36 | _DAT_0021ca20) ^ _DAT_0021ca40;
          iVar23 = auVar25._0_4_;
          iVar40 = auVar25._8_4_;
          auVar99._4_4_ = iVar23;
          auVar99._0_4_ = iVar23;
          auVar99._8_4_ = iVar40;
          auVar99._12_4_ = iVar40;
          auVar125._0_4_ = -(uint)(iVar23 < (int)local_1158);
          auVar125._4_4_ = -(uint)(iVar23 < local_1158._4_4_);
          auVar125._8_4_ = -(uint)(iVar40 < iStack_1150);
          auVar125._12_4_ = -(uint)(iVar40 < iStack_114c);
          auVar67._0_4_ = -(uint)(auVar25._4_4_ == (int)local_1148);
          auVar67._4_4_ = -(uint)(auVar25._4_4_ == local_1148._4_4_);
          auVar67._8_4_ = -(uint)(auVar25._12_4_ == iStack_1140);
          auVar67._12_4_ = -(uint)(auVar25._12_4_ == iStack_113c);
          auVar67 = auVar67 & auVar125;
          auVar25 = pshuflw(auVar99,auVar67,0xe8);
          auVar25 = packssdw(auVar25,auVar25);
          if ((auVar25 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar8[-0x70] = 0;
          }
          auVar25 = packssdw(auVar67,auVar67);
          auVar25 = packssdw(auVar25,auVar25);
          if ((auVar25._0_4_ >> 0x10 & 1) != 0) {
            puVar8[-0x60] = 0;
          }
          auVar25 = (auVar36 | _DAT_0021ca10) ^ _DAT_0021ca40;
          iVar23 = auVar25._0_4_;
          iVar40 = auVar25._8_4_;
          auVar100._4_4_ = iVar23;
          auVar100._0_4_ = iVar23;
          auVar100._8_4_ = iVar40;
          auVar100._12_4_ = iVar40;
          auVar126._0_4_ = -(uint)(iVar23 < (int)local_1158);
          auVar126._4_4_ = -(uint)(iVar23 < local_1158._4_4_);
          auVar126._8_4_ = -(uint)(iVar40 < iStack_1150);
          auVar126._12_4_ = -(uint)(iVar40 < iStack_114c);
          auVar68._0_4_ = -(uint)(auVar25._4_4_ == (int)local_1148);
          auVar68._4_4_ = -(uint)(auVar25._4_4_ == local_1148._4_4_);
          auVar68._8_4_ = -(uint)(auVar25._12_4_ == iStack_1140);
          auVar68._12_4_ = -(uint)(auVar25._12_4_ == iStack_113c);
          auVar68 = auVar68 & auVar126;
          auVar25 = packssdw(auVar100,auVar68);
          auVar25 = packssdw(auVar25,auVar25);
          if ((auVar25 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar8[-0x50] = 0;
          }
          auVar25 = pshufhw(auVar68,auVar68,0x84);
          auVar25 = packssdw(auVar25,auVar25);
          if ((auVar25 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar8[-0x40] = 0;
          }
          auVar25 = (auVar36 | _DAT_0021ca00) ^ _DAT_0021ca40;
          iVar23 = auVar25._0_4_;
          iVar40 = auVar25._8_4_;
          auVar101._4_4_ = iVar23;
          auVar101._0_4_ = iVar23;
          auVar101._8_4_ = iVar40;
          auVar101._12_4_ = iVar40;
          auVar127._0_4_ = -(uint)(iVar23 < (int)local_1158);
          auVar127._4_4_ = -(uint)(iVar23 < local_1158._4_4_);
          auVar127._8_4_ = -(uint)(iVar40 < iStack_1150);
          auVar127._12_4_ = -(uint)(iVar40 < iStack_114c);
          auVar69._0_4_ = -(uint)(auVar25._4_4_ == (int)local_1148);
          auVar69._4_4_ = -(uint)(auVar25._4_4_ == local_1148._4_4_);
          auVar69._8_4_ = -(uint)(auVar25._12_4_ == iStack_1140);
          auVar69._12_4_ = -(uint)(auVar25._12_4_ == iStack_113c);
          auVar69 = auVar69 & auVar127;
          auVar25 = pshuflw(auVar101,auVar69,0xe8);
          auVar25 = packssdw(auVar25,auVar25);
          if ((auVar25 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar8[-0x30] = 0;
          }
          auVar25 = packssdw(auVar69,auVar69);
          auVar25 = packssdw(auVar25,auVar25);
          if ((auVar25 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            puVar8[-0x20] = 0;
          }
          auVar25 = (auVar36 | _DAT_0021c9f0) ^ _DAT_0021ca40;
          iVar23 = auVar25._0_4_;
          iVar40 = auVar25._8_4_;
          auVar70._4_4_ = iVar23;
          auVar70._0_4_ = iVar23;
          auVar70._8_4_ = iVar40;
          auVar70._12_4_ = iVar40;
          auVar102._0_4_ = -(uint)(iVar23 < (int)local_1158);
          auVar102._4_4_ = -(uint)(iVar23 < local_1158._4_4_);
          auVar102._8_4_ = -(uint)(iVar40 < iStack_1150);
          auVar102._12_4_ = -(uint)(iVar40 < iStack_114c);
          auVar37._0_4_ = -(uint)(auVar25._4_4_ == (int)local_1148);
          auVar37._4_4_ = -(uint)(auVar25._4_4_ == local_1148._4_4_);
          auVar37._8_4_ = -(uint)(auVar25._12_4_ == iStack_1140);
          auVar37._12_4_ = -(uint)(auVar25._12_4_ == iStack_113c);
          auVar37 = auVar37 & auVar102;
          auVar25 = packssdw(auVar70,auVar37);
          auVar25 = packssdw(auVar25,auVar25);
          if ((auVar25 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar8[-0x10] = 0;
          }
          auVar25 = pshufhw(auVar37,auVar37,0x84);
          auVar25 = packssdw(auVar25,auVar25);
          if ((auVar25 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *puVar8 = 0;
          }
          lVar20 = lVar20 + 8;
          puVar8 = puVar8 + 0x80;
        } while (lVar20 != 0x28);
        local_ad8 = 0;
        bVar4 = matchit::impl::
                matchPattern<mathiu::impl::Expr_const&,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,int>>>,matchit::impl::Context<mathiu::impl::Power_const*,bool,int_const*,bool,mathiu::impl::Product_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool>>
                          ((Expr *)local_1160,&local_1048,1,
                           (Context<const_mathiu::impl::Power_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Product_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool>
                            *)&local_cf8);
        pp_Var16 = local_1020;
        if (!bVar4) {
          lVar20 = 0;
          memset(&local_cf8,0,0x220);
          puVar8 = local_c80;
          do {
            auVar38._8_4_ = (int)lVar20;
            auVar38._0_8_ = lVar20;
            auVar38._12_4_ = (int)((ulong)lVar20 >> 0x20);
            auVar25 = (auVar38 | _DAT_0021ca20) ^ _DAT_0021ca40;
            iVar23 = auVar25._0_4_;
            iVar40 = auVar25._8_4_;
            auVar103._4_4_ = iVar23;
            auVar103._0_4_ = iVar23;
            auVar103._8_4_ = iVar40;
            auVar103._12_4_ = iVar40;
            auVar128._0_4_ = -(uint)(iVar23 < (int)local_1158);
            auVar128._4_4_ = -(uint)(iVar23 < local_1158._4_4_);
            auVar128._8_4_ = -(uint)(iVar40 < iStack_1150);
            auVar128._12_4_ = -(uint)(iVar40 < iStack_114c);
            auVar71._0_4_ = -(uint)(auVar25._4_4_ == (int)local_1148);
            auVar71._4_4_ = -(uint)(auVar25._4_4_ == local_1148._4_4_);
            auVar71._8_4_ = -(uint)(auVar25._12_4_ == iStack_1140);
            auVar71._12_4_ = -(uint)(auVar25._12_4_ == iStack_113c);
            auVar71 = auVar71 & auVar128;
            auVar25 = pshuflw(auVar103,auVar71,0xe8);
            auVar25 = packssdw(auVar25,auVar25);
            if ((auVar25 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar8[-0x70] = 0;
            }
            auVar25 = packssdw(auVar71,auVar71);
            auVar25 = packssdw(auVar25,auVar25);
            if ((auVar25._0_4_ >> 0x10 & 1) != 0) {
              puVar8[-0x60] = 0;
            }
            auVar25 = (auVar38 | _DAT_0021ca10) ^ _DAT_0021ca40;
            iVar23 = auVar25._0_4_;
            iVar40 = auVar25._8_4_;
            auVar104._4_4_ = iVar23;
            auVar104._0_4_ = iVar23;
            auVar104._8_4_ = iVar40;
            auVar104._12_4_ = iVar40;
            auVar129._0_4_ = -(uint)(iVar23 < (int)local_1158);
            auVar129._4_4_ = -(uint)(iVar23 < local_1158._4_4_);
            auVar129._8_4_ = -(uint)(iVar40 < iStack_1150);
            auVar129._12_4_ = -(uint)(iVar40 < iStack_114c);
            auVar72._0_4_ = -(uint)(auVar25._4_4_ == (int)local_1148);
            auVar72._4_4_ = -(uint)(auVar25._4_4_ == local_1148._4_4_);
            auVar72._8_4_ = -(uint)(auVar25._12_4_ == iStack_1140);
            auVar72._12_4_ = -(uint)(auVar25._12_4_ == iStack_113c);
            auVar72 = auVar72 & auVar129;
            auVar25 = packssdw(auVar104,auVar72);
            auVar25 = packssdw(auVar25,auVar25);
            if ((auVar25 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              puVar8[-0x50] = 0;
            }
            auVar25 = pshufhw(auVar72,auVar72,0x84);
            auVar25 = packssdw(auVar25,auVar25);
            if ((auVar25 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              puVar8[-0x40] = 0;
            }
            auVar25 = (auVar38 | _DAT_0021ca00) ^ _DAT_0021ca40;
            iVar23 = auVar25._0_4_;
            iVar40 = auVar25._8_4_;
            auVar105._4_4_ = iVar23;
            auVar105._0_4_ = iVar23;
            auVar105._8_4_ = iVar40;
            auVar105._12_4_ = iVar40;
            auVar130._0_4_ = -(uint)(iVar23 < (int)local_1158);
            auVar130._4_4_ = -(uint)(iVar23 < local_1158._4_4_);
            auVar130._8_4_ = -(uint)(iVar40 < iStack_1150);
            auVar130._12_4_ = -(uint)(iVar40 < iStack_114c);
            auVar73._0_4_ = -(uint)(auVar25._4_4_ == (int)local_1148);
            auVar73._4_4_ = -(uint)(auVar25._4_4_ == local_1148._4_4_);
            auVar73._8_4_ = -(uint)(auVar25._12_4_ == iStack_1140);
            auVar73._12_4_ = -(uint)(auVar25._12_4_ == iStack_113c);
            auVar73 = auVar73 & auVar130;
            auVar25 = pshuflw(auVar105,auVar73,0xe8);
            auVar25 = packssdw(auVar25,auVar25);
            if ((auVar25 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar8[-0x30] = 0;
            }
            auVar25 = packssdw(auVar73,auVar73);
            auVar25 = packssdw(auVar25,auVar25);
            if ((auVar25 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              puVar8[-0x20] = 0;
            }
            auVar25 = (auVar38 | _DAT_0021c9f0) ^ _DAT_0021ca40;
            iVar23 = auVar25._0_4_;
            iVar40 = auVar25._8_4_;
            auVar74._4_4_ = iVar23;
            auVar74._0_4_ = iVar23;
            auVar74._8_4_ = iVar40;
            auVar74._12_4_ = iVar40;
            auVar106._0_4_ = -(uint)(iVar23 < (int)local_1158);
            auVar106._4_4_ = -(uint)(iVar23 < local_1158._4_4_);
            auVar106._8_4_ = -(uint)(iVar40 < iStack_1150);
            auVar106._12_4_ = -(uint)(iVar40 < iStack_114c);
            auVar39._0_4_ = -(uint)(auVar25._4_4_ == (int)local_1148);
            auVar39._4_4_ = -(uint)(auVar25._4_4_ == local_1148._4_4_);
            auVar39._8_4_ = -(uint)(auVar25._12_4_ == iStack_1140);
            auVar39._12_4_ = -(uint)(auVar25._12_4_ == iStack_113c);
            auVar39 = auVar39 & auVar106;
            auVar25 = packssdw(auVar74,auVar39);
            auVar25 = packssdw(auVar25,auVar25);
            if ((auVar25 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              puVar8[-0x10] = 0;
            }
            auVar25 = pshufhw(auVar39,auVar39,0x84);
            auVar25 = packssdw(auVar25,auVar25);
            if ((auVar25 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *puVar8 = 0;
            }
            lVar20 = lVar20 + 8;
            puVar8 = puVar8 + 0x80;
          } while (lVar20 != 0x28);
          local_ad8 = 0;
          bVar4 = matchit::impl::
                  matchPattern<mathiu::impl::Expr_const&,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<int>>>>,matchit::impl::Context<mathiu::impl::Power_const*,bool,int_const*,bool,mathiu::impl::Product_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool>>
                            ((Expr *)local_1168,&local_f98,1,
                             (Context<const_mathiu::impl::Power_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Product_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool>
                              *)&local_cf8);
          if (bVar4) {
            local_1178 = (PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:521:78)>
                          *)0x0;
            if (*(char *)&(((_Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::And<matchit::impl::Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:304:9)>,_matchit::impl::Id<int>_>_>_>_>_>
                             *)&(local_1160->mPattern).mPatterns.
                                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                                .
                                super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
                           )->
                          super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::And<matchit::impl::Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:304:9)>,_matchit::impl::Id<int>_>_>_>_>,_false>
                          )._M_head_impl.mPattern.mPatterns.
                          super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::And<matchit::impl::Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:304:9)>,_matchit::impl::Id<int>_>_>_>
                          .
                          super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::And<matchit::impl::Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:304:9)>,_matchit::impl::Id<int>_>_>_>
                          .
                          super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::And<matchit::impl::Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:304:9)>,_matchit::impl::Id<int>_>_>,_false>
                          ._M_head_impl.mPattern.mPatterns.
                          super__Tuple_impl<0UL,_matchit::impl::Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:304:9)>,_matchit::impl::Id<int>_>
                          .
                          super__Head_base<0UL,_matchit::impl::Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:304:9)>,_false>
                          ._M_head_impl.super_anon_class_16_2_9473206a.u == '\0') {
              local_1178 = local_1160;
            }
            std::
            variant<std::monostate,mathiu::impl::Power_const*,mathiu::impl::Product_const*,mathiu::impl::Fraction_const*,int_const*,bool>
            ::operator=((variant<std::monostate,mathiu::impl::Power_const*,mathiu::impl::Product_const*,mathiu::impl::Fraction_const*,int_const*,bool>
                         *)(&local_cf8 + local_ad8 * 2),(int **)&local_1178);
            lVar20 = local_ad8 * 2;
            local_ad8 = local_ad8 + 1;
            value_02 = std::
                       get<4ul,std::monostate,mathiu::impl::Power_const*,mathiu::impl::Product_const*,mathiu::impl::Fraction_const*,int_const*,bool>
                                 ((variant<std::monostate,_const_mathiu::impl::Power_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::Fraction_*,_const_int_*,_bool>
                                   *)(&local_cf8 + lVar20));
            bVar4 = matchit::impl::
                    PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
                    ::
                    matchPatternImpl<int_const*&,matchit::impl::Context<mathiu::impl::Power_const*,bool,int_const*,bool,mathiu::impl::Product_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,int_const*,bool,mathiu::impl::Fraction_const*,bool,int_const*,bool>>
                              (value_02,&local_fa8,3,
                               (Context<const_mathiu::impl::Power_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Product_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool>
                                *)&local_cf8);
            if (bVar4) {
              bVar4 = matchit::impl::
                      PatternTraits<matchit::impl::And<matchit::impl::Meet<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:309:9)>,_matchit::impl::Id<int>_>_>
                      ::
                      matchPatternImpl<const_int_&,_matchit::impl::Context<const_mathiu::impl::Power_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Product_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool>_>
                                (*value_02,
                                 (And<matchit::impl::Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:309:9)>,_matchit::impl::Id<int>_>
                                  *)&local_fd8._M_first,4,
                                 (Context<const_mathiu::impl::Power_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Product_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_int_*,_bool>
                                  *)&local_cf8);
              IVar19 = (IdProcess)bVar4;
              matchit::impl::PatternTraits<matchit::impl::Id<int>_>::processIdImpl
                        ((Id<int> *)&local_fd8._M_first,4,IVar19);
              matchit::impl::PatternTraits<matchit::impl::Id<int>_>::processIdImpl
                        ((Id<int> *)&local_fd8._M_first,3,(uint)bVar4);
            }
            else {
              IVar19 = kCANCEL;
            }
            matchit::impl::PatternTraits<matchit::impl::Id<int>_>::processIdImpl
                      ((Id<int> *)&local_fd8._M_first,2,IVar19);
            matchit::impl::PatternTraits<matchit::impl::Id<int>_>::processIdImpl
                      ((Id<int> *)&local_fd8._M_first,1,IVar19);
          }
          else {
            IVar19 = kCANCEL;
          }
          matchit::impl::PatternTraits<matchit::impl::Id<int>_>::processIdImpl
                    (&local_f98.mPattern.mPatterns.
                      super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
                      .
                      super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>
                      .
                      super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>,_false>
                      ._M_head_impl.mPattern,0,IVar19);
          matchit::impl::PatternTraits<matchit::impl::Id<int>_>::processIdImpl
                    ((Id<int> *)&local_fd8._M_first,0,IVar19);
          if (IVar19 == kCANCEL) {
            bVar4 = matchit::impl::matchPatterns<$a350f72c$>::anon_class_1_0_00000001::
                    operator()<matchit::impl::PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::And<matchit::impl::Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:304:9)>,_matchit::impl::Id<int>_>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:520:76)>,_std::tuple<const_mathiu::impl::Expr_&,_const_mathiu::impl::Expr_&>_&>
                              ((anon_class_1_0_00000001 *)&local_898,
                               (PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::And<matchit::impl::Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:304:9)>,_matchit::impl::Id<int>_>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:520:76)>
                                *)local_1160,
                               (tuple<const_mathiu::impl::Expr_&,_const_mathiu::impl::Expr_&> *)
                               local_1168,(RetType_conflict *)local_1188);
            p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1188._0_8_;
            _Var15._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1188._8_8_;
            if (((!bVar4) &&
                (bVar4 = matchit::impl::matchPatterns<$a350f72c$>::anon_class_1_0_00000001::
                         operator()<matchit::impl::PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:521:78)>,_std::tuple<const_mathiu::impl::Expr_&,_const_mathiu::impl::Expr_&>_&>
                                   ((anon_class_1_0_00000001 *)&local_db8,local_1160,
                                    (tuple<const_mathiu::impl::Expr_&,_const_mathiu::impl::Expr_&> *
                                    )local_1168,(RetType_conflict *)local_1188),
                p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1188._0_8_,
                _Var15._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1188._8_8_,
                !bVar4)) &&
               (bVar4 = matchit::impl::matchPatterns<$a350f72c$>::anon_class_1_0_00000001::
                        operator()<matchit::impl::PatternPair<matchit::impl::Wildcard,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:522:31)>,_std::tuple<const_mathiu::impl::Expr_&,_const_mathiu::impl::Expr_&>_&>
                                  (local_ad0,
                                   (PatternPair<matchit::impl::Wildcard,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:522:31)>
                                    *)local_1188,value_03,result),
               p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1188._0_8_,
               _Var15._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1188._8_8_,
               !bVar4)) {
              this_01 = (logic_error *)__cxa_allocate_exception(0x10);
              std::logic_error::logic_error(this_01,"Error: no patterns got matched!");
              pcVar18 = std::logic_error::~logic_error;
              puVar21 = &std::logic_error::typeinfo;
              goto LAB_0018dfaa;
            }
          }
          else {
            pIVar6 = (*std::__detail::__variant::
                       __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
                       ::_S_vtable._M_arr
                       [(byte)(&local_f58->_M_first)[1]._M_storage.super_IdBlockBase<int>.mDepth].
                       _M_data)((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                                 *)&local_1178,
                                (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                                 *)&local_f58->_M_first);
            piVar17 = (*std::__detail::__variant::
                        __gen_vtable<std::__detail::__variant::__deduce_visit_result<const_int_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1186:30),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1187:33),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1188:33),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1189:33)>_&&,_const_std::variant<std::monostate,_int,_int_*,_const_int_*>_&>
                        ::_S_vtable._M_arr
                        [(pIVar6->super_IdBlockBase<int>).mVariant.
                         super__Variant_base<std::monostate,_int,_int_*,_const_int_*>.
                         super__Move_assign_alias<std::monostate,_int,_int_*,_const_int_*>.
                         super__Copy_assign_alias<std::monostate,_int,_int_*,_const_int_*>.
                         super__Move_ctor_alias<std::monostate,_int,_int_*,_const_int_*>.
                         super__Copy_ctor_alias<std::monostate,_int,_int_*,_const_int_*>.
                         super__Variant_storage_alias<std::monostate,_int,_int_*,_const_int_*>.
                         _M_index]._M_data)
                                ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>
                                  *)&local_1178,&(pIVar6->super_IdBlockBase<int>).mVariant);
            iVar23 = *piVar17;
            pIVar6 = (*std::__detail::__variant::
                       __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
                       ::_S_vtable._M_arr
                       [(byte)(&local_f50->_M_first)[1]._M_storage.super_IdBlockBase<int>.mDepth].
                       _M_data)((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                                 *)&local_1178,
                                (variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                                 *)&local_f50->_M_first);
            piVar17 = (*std::__detail::__variant::
                        __gen_vtable<std::__detail::__variant::__deduce_visit_result<const_int_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1186:30),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1187:33),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1188:33),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1189:33)>_&&,_const_std::variant<std::monostate,_int,_int_*,_const_int_*>_&>
                        ::_S_vtable._M_arr
                        [(pIVar6->super_IdBlockBase<int>).mVariant.
                         super__Variant_base<std::monostate,_int,_int_*,_const_int_*>.
                         super__Move_assign_alias<std::monostate,_int,_int_*,_const_int_*>.
                         super__Copy_assign_alias<std::monostate,_int,_int_*,_const_int_*>.
                         super__Move_ctor_alias<std::monostate,_int,_int_*,_const_int_*>.
                         super__Copy_ctor_alias<std::monostate,_int,_int_*,_const_int_*>.
                         super__Variant_storage_alias<std::monostate,_int,_int_*,_const_int_*>.
                         _M_index]._M_data)
                                ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>
                                  *)&local_1178,&(pIVar6->super_IdBlockBase<int>).mVariant);
            local_1168 = (PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:521:78)>
                          *)::pow((double)iVar23,(double)*piVar17);
            _Var15._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
            (_Var15._M_pi)->_M_use_count = 1;
            (_Var15._M_pi)->_M_weak_count = 1;
            (_Var15._M_pi)->_vptr__Sp_counted_base =
                 (_func_int **)&PTR___Sp_counted_ptr_inplace_00263778;
            *(int *)&_Var15._M_pi[1]._vptr__Sp_counted_base = (int)(double)local_1168;
            *(undefined1 *)&_Var15._M_pi[4]._M_use_count = 0;
            p_Var1 = _Var15._M_pi + 1;
          }
          goto LAB_0018d9cd;
        }
      }
    }
    p_Var1 = *pp_Var16;
    _Var15._M_pi = pp_Var16[1];
    if (_Var15._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0018d9cd;
    if (__libc_single_threaded != '\0') {
      (_Var15._M_pi)->_M_use_count = (_Var15._M_pi)->_M_use_count + 1;
      goto LAB_0018d9cd;
    }
    LOCK();
    (_Var15._M_pi)->_M_use_count = (_Var15._M_pi)->_M_use_count + 1;
    UNLOCK();
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1188._8_8_;
  }
  else {
    pIVar12 = std::
              visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Product>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Product>&)_1_,matchit::impl::Id<mathiu::impl::Product>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Product>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Product>,matchit::impl::IdBlock<mathiu::impl::Product>*>&>
                        ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                          *)&local_1178,
                         (variant<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                          *)&local_9c8->_M_first);
    pPVar13 = std::
              visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product*)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Product,mathiu::impl::Product*,mathiu::impl::Product_const*>const&>
                        ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>
                          *)&local_1178,
                         &(pIVar12->super_IdBlockBase<mathiu::impl::Product>).mVariant);
    p_Var14 = (pPVar13->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    pIVar12 = std::
              visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Product>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Product>&)_1_,matchit::impl::Id<mathiu::impl::Product>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Product>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Product>,matchit::impl::IdBlock<mathiu::impl::Product>*>&>
                        ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                          *)&local_1178,
                         (variant<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                          *)&local_9c8->_M_first);
    pPVar13 = std::
              visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product*)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Product,mathiu::impl::Product*,mathiu::impl::Product_const*>const&>
                        ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>
                          *)&local_1178,
                         &(pIVar12->super_IdBlockBase<mathiu::impl::Product>).mVariant);
    local_1128.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
    p_Var22 = &(pPVar13->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header;
    (local_1128.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi)->_M_use_count = 1;
    (local_1128.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi)->_M_weak_count = 1;
    (local_1128.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00263778;
    local_1128.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (local_1128.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi + 1);
    *(undefined4 *)
     &local_1128.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[1]._vptr__Sp_counted_base = 1;
    *(undefined1 *)
     &local_1128.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[4]._M_use_count = 0;
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_1128.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    _Var15._M_pi = local_1128.
                   super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
    if ((_Rb_tree_header *)p_Var14 == p_Var22) goto LAB_0018d9cd;
    dVar24 = extraout_XMM0_Qa;
    do {
      pow((impl *)&local_1178,dVar24,auVar50._0_8_);
      operator*((impl *)&local_1118,&local_1128,(ExprPtr *)&local_1178);
      if (local_1170 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1170);
      }
      _Var15._M_pi = local_1128.
                     super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
      local_1128.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_1118;
      local_1128.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Stack_1110;
      if (_Var15._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var15._M_pi);
      }
      p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
      auVar50._8_8_ = extraout_XMM1_Qb;
      auVar50._0_8_ = extraout_XMM1_Qa;
      dVar24 = extraout_XMM0_Qa_00;
      p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_1128.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      _Var15._M_pi = local_1128.
                     super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1188._8_8_;
    } while ((_Rb_tree_header *)p_Var14 != p_Var22);
  }
  local_1188._8_8_ = _Var15._M_pi;
  local_1188._0_8_ = p_Var1;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1188._0_8_;
  _Var15._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1188._8_8_;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1188._0_8_;
    _Var15._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1188._8_8_;
  }
LAB_0018d9cd:
  local_1188._8_8_ = _Var15._M_pi;
  local_1188._0_8_ = p_Var1;
  *(undefined8 *)local_1100 = local_1188._0_8_;
  *(undefined8 *)(local_1100 + 8) = local_1188._8_8_;
  if (local_1070 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1070);
  }
  if (local_1060 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1060);
  }
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage(&local_a20);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage(&local_3d0);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage(&local_2c8);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                       *)&local_228.mPattern.mPatterns.
                          super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>
                          .
                          super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>
                          .
                          super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>,_false>
                          ._M_head_impl.mPattern);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage(&local_270);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_670.
                          super__Head_base<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
                     );
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_670);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_470.
                          super__Head_base<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
                     );
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_470);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_580.
                          super__Head_base<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
                     );
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_580);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_378.mPattern.mPatterns.
                          super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
                          .
                          super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
                          .
                          super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_false>
                          ._M_head_impl.mPattern.mPatterns.
                          super__Tuple_impl<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                          .
                          super__Head_base<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
                     );
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_378.mPattern.mPatterns.
                          super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
                          .
                          super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
                          .
                          super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_false>
                          ._M_head_impl.mPattern);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_520.
                          super__Head_base<0UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
                     );
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_520);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                       *)&local_600._M_first);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage(&local_4d0);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage(&local_7f0);
  return extraout_XMM0_Qa_01;
}

Assistant:

ExprPtr pow(ExprPtr const &lhs, ExprPtr const &rhs)
    {
        Id<ExprPtr> iu, iv;
        Id<Integer> ii1, ii2, ii3;
        Id<Product> ip;
        return match(*lhs, *rhs)(
            // clang-format off
                // basic power transformation 2,3
                pattern | ds(as<Power>(ds(iu, iv)), as<int>(_)) = iu^(iv * rhs),
                pattern | ds(as<Product>(ip), as<int>(_)) = [&] {
                    return std::accumulate((*ip).begin(), (*ip).end(), 1_i, [&](auto&& p, auto&& e)
                    {
                        return p * ((e.second)^rhs);
                    });
                },
                // basic identity transformation
                pattern | ds(as<Integer>(0), or_(as<Integer>(_), as<Fraction>(_))) | when([&]{ return evald(rhs) > 0; }) = expr(0_i),
                pattern | ds(as<Integer>(0), _)= [&] { throw std::runtime_error{"undefined!"}; return 0_i;},
                pattern | ds(as<Integer>(1), _)= [&] { return 1_i;},
                pattern | ds(_, as<Integer>(0))= expr(1_i),
                pattern | ds(_, as<Integer>(1))= expr(lhs),
                pattern | ds(as<Integer>(ii1), as<Integer>(ii2.at(_>0))) = [&] {return integer(static_cast<Integer>(std::pow(*ii1, *ii2))); },
                pattern | ds(as<Integer>(ii1), as<Integer>(ii2.at(_<0))) = [&] {return fraction(1, static_cast<Integer>(std::pow(*ii1, -(*ii2)))); },
                pattern | ds(as<Fraction>(ds(ii1, ii2)), as<Integer>(ii3)) = [&] {return simplifyRational(fraction(static_cast<Integer>(std::pow(*ii1, *ii3)), static_cast<Integer>(std::pow(*ii2, *ii3)))); },
                pattern | _ = [&] {
                    return makeSharedExprPtr(Power{{lhs, rhs}});
                }
            );
        }